

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void iadst16x16_low8_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined8 uVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  undefined8 uVar65;
  undefined8 uVar66;
  undefined8 uVar67;
  undefined8 uVar68;
  undefined8 uVar69;
  undefined8 uVar70;
  undefined8 uVar71;
  undefined8 uVar72;
  undefined8 uVar73;
  undefined8 uVar74;
  undefined8 uVar75;
  undefined8 uVar76;
  undefined8 uVar77;
  undefined8 uVar78;
  undefined8 uVar79;
  undefined8 uVar80;
  undefined8 uVar81;
  undefined8 uVar82;
  undefined8 uVar83;
  undefined8 uVar84;
  undefined8 uVar85;
  undefined8 uVar86;
  undefined8 uVar87;
  undefined8 uVar88;
  undefined8 uVar89;
  undefined8 uVar90;
  undefined8 uVar91;
  int in_ECX;
  uint in_EDX;
  undefined8 *in_RSI;
  undefined1 (*in_RDI) [16];
  __m128i *in_R8;
  uint in_R9D;
  undefined4 in_register_0000008c;
  int iVar95;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  int iVar96;
  __m128i in0;
  __m128i in0_00;
  __m128i in0_01;
  __m128i in0_02;
  __m128i in0_03;
  __m128i in0_04;
  __m128i in0_05;
  __m128i in0_06;
  __m128i in0_07;
  __m128i in0_08;
  __m128i in0_09;
  __m128i in0_10;
  __m128i in0_11;
  __m128i in0_12;
  __m128i in0_13;
  __m128i in0_14;
  __m128i in0_15;
  __m128i in0_16;
  __m128i in0_17;
  __m128i in0_18;
  __m128i in0_19;
  __m128i in0_20;
  __m128i in0_21;
  __m128i in0_22;
  __m128i in0_23;
  __m128i in0_24;
  __m128i in0_25;
  __m128i in0_26;
  __m128i in0_27;
  __m128i in0_28;
  __m128i in0_29;
  __m128i in0_30;
  __m128i in1;
  __m128i in1_00;
  __m128i in1_01;
  __m128i in1_02;
  __m128i in1_03;
  __m128i in1_04;
  __m128i in1_05;
  __m128i in1_06;
  __m128i in1_07;
  __m128i in1_08;
  __m128i in1_09;
  __m128i in1_10;
  __m128i in1_11;
  __m128i in1_12;
  __m128i in1_13;
  __m128i in1_14;
  __m128i in1_15;
  __m128i in1_16;
  __m128i in1_17;
  __m128i in1_18;
  __m128i in1_19;
  __m128i in1_20;
  __m128i in1_21;
  __m128i in1_22;
  __m128i in1_23;
  __m128i in1_24;
  __m128i in1_25;
  __m128i in1_26;
  __m128i in1_27;
  __m128i in1_28;
  __m128i in1_29;
  __m128i in1_30;
  __m128i clamp_hi_out;
  __m128i clamp_lo_out;
  int log_range_out;
  __m128i y;
  __m128i x;
  __m128i u [16];
  __m128i zero;
  __m128i clamp_hi;
  __m128i clamp_lo;
  int log_range;
  __m128i rnding;
  __m128i cospi32;
  __m128i cospim48;
  __m128i cospi16;
  __m128i cospi48;
  __m128i cospim24;
  __m128i cospim56;
  __m128i cospi24;
  __m128i cospi40;
  __m128i cospi56;
  __m128i cospi8;
  __m128i cospi6;
  __m128i cospi58;
  __m128i cospi14;
  __m128i cospi50;
  __m128i cospi22;
  __m128i cospi42;
  __m128i cospi30;
  __m128i cospi34;
  __m128i cospi38;
  __m128i cospi26;
  __m128i cospi46;
  __m128i cospi18;
  __m128i cospi54;
  __m128i cospi10;
  __m128i cospi62;
  __m128i cospi2;
  int32_t *cospi;
  __m128i *in_stack_ffffffffffffe298;
  undefined4 in_stack_ffffffffffffe2a0;
  int iVar97;
  undefined8 uVar98;
  undefined8 local_1d48;
  undefined8 uStack_1d40;
  int local_1d2c;
  undefined1 local_1d28 [16];
  undefined1 local_1d18 [16];
  int local_1d08;
  int iStack_1d04;
  int iStack_1d00;
  int iStack_1cfc;
  int local_1cf8;
  int iStack_1cf4;
  int iStack_1cf0;
  int iStack_1cec;
  int local_1ce8;
  int iStack_1ce4;
  int iStack_1ce0;
  int iStack_1cdc;
  int local_1cd8;
  int iStack_1cd4;
  int iStack_1cd0;
  int iStack_1ccc;
  undefined1 local_1cc8 [16];
  int local_1cb8;
  int iStack_1cb4;
  int iStack_1cb0;
  int iStack_1cac;
  undefined1 local_1ca8 [16];
  int local_1c98;
  int iStack_1c94;
  int iStack_1c90;
  int iStack_1c8c;
  undefined1 local_1c88 [16];
  undefined1 local_1c78 [16];
  undefined1 local_1c68 [16];
  undefined1 local_1c58 [16];
  undefined1 local_1c48 [16];
  undefined1 local_1c38 [16];
  undefined1 local_1c28 [16];
  undefined1 local_1c18 [16];
  undefined8 local_1c08;
  undefined8 uStack_1c00;
  undefined8 local_1bf8;
  undefined8 uStack_1bf0;
  undefined8 local_1be8;
  undefined8 uStack_1be0;
  int local_1bcc;
  int local_1bc8;
  int iStack_1bc4;
  int iStack_1bc0;
  int iStack_1bbc;
  undefined8 local_1bb8;
  undefined8 uStack_1bb0;
  undefined8 local_1ba8;
  undefined8 uStack_1ba0;
  undefined8 local_1b98;
  undefined8 uStack_1b90;
  undefined8 local_1b88;
  undefined8 uStack_1b80;
  undefined8 local_1b78;
  undefined8 uStack_1b70;
  undefined8 local_1b68;
  undefined8 uStack_1b60;
  undefined8 local_1b58;
  undefined8 uStack_1b50;
  undefined8 local_1b48;
  undefined8 uStack_1b40;
  undefined8 local_1b38;
  undefined8 uStack_1b30;
  undefined8 local_1b28;
  undefined8 uStack_1b20;
  undefined8 local_1b18;
  undefined8 uStack_1b10;
  undefined8 local_1b08;
  undefined8 uStack_1b00;
  undefined8 local_1af8;
  undefined8 uStack_1af0;
  undefined8 local_1ae8;
  undefined8 uStack_1ae0;
  undefined8 local_1ad8;
  undefined8 uStack_1ad0;
  undefined8 local_1ac8;
  undefined8 uStack_1ac0;
  undefined8 local_1ab8;
  undefined8 uStack_1ab0;
  undefined8 local_1aa8;
  undefined8 uStack_1aa0;
  undefined8 local_1a98;
  undefined8 uStack_1a90;
  undefined8 local_1a88;
  undefined8 uStack_1a80;
  undefined8 local_1a78;
  undefined8 uStack_1a70;
  undefined8 local_1a68;
  undefined8 uStack_1a60;
  undefined8 local_1a58;
  undefined8 uStack_1a50;
  undefined8 local_1a48;
  undefined8 uStack_1a40;
  undefined8 local_1a38;
  undefined8 uStack_1a30;
  undefined8 local_1a28;
  undefined8 uStack_1a20;
  int32_t *local_1a18;
  uint local_1a10;
  int local_1a0c;
  int local_1a08;
  uint local_1a04;
  undefined8 *local_1a00;
  undefined1 (*local_19f8) [16];
  uint local_19ec;
  undefined8 local_19e8;
  undefined8 uStack_19e0;
  uint local_19cc;
  undefined8 local_19c8;
  undefined8 uStack_19c0;
  uint local_19ac;
  undefined8 local_19a8;
  undefined8 uStack_19a0;
  uint local_198c;
  undefined8 local_1988;
  undefined8 uStack_1980;
  uint local_196c;
  undefined8 local_1968;
  undefined8 uStack_1960;
  uint local_194c;
  undefined8 local_1948;
  undefined8 uStack_1940;
  uint local_192c;
  undefined8 local_1928;
  undefined8 uStack_1920;
  uint local_190c;
  undefined8 local_1908;
  undefined8 uStack_1900;
  uint local_18ec;
  undefined8 local_18e8;
  undefined8 uStack_18e0;
  uint local_18cc;
  undefined8 local_18c8;
  undefined8 uStack_18c0;
  uint local_18ac;
  undefined8 local_18a8;
  undefined8 uStack_18a0;
  uint local_188c;
  undefined8 local_1888;
  undefined8 uStack_1880;
  uint local_186c;
  undefined8 local_1868;
  undefined8 uStack_1860;
  uint local_184c;
  undefined8 local_1848;
  undefined8 uStack_1840;
  uint local_182c;
  undefined8 local_1828;
  undefined8 uStack_1820;
  uint local_180c;
  undefined8 local_1808;
  undefined8 uStack_1800;
  uint local_17ec;
  undefined8 local_17e8;
  undefined8 uStack_17e0;
  uint local_17cc;
  undefined8 local_17c8;
  undefined8 uStack_17c0;
  uint local_17ac;
  undefined8 local_17a8;
  undefined8 uStack_17a0;
  uint local_178c;
  undefined8 local_1788;
  undefined8 uStack_1780;
  uint local_176c;
  undefined8 local_1768;
  undefined8 uStack_1760;
  uint local_174c;
  undefined8 local_1748;
  undefined8 uStack_1740;
  uint local_172c;
  undefined8 local_1728;
  undefined8 uStack_1720;
  uint local_170c;
  undefined8 local_1708;
  undefined8 uStack_1700;
  uint local_16ec;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  uint local_16cc;
  undefined8 local_16c8;
  undefined8 uStack_16c0;
  uint local_16ac;
  undefined8 local_16a8;
  undefined8 uStack_16a0;
  uint local_168c;
  undefined8 local_1688;
  undefined8 uStack_1680;
  uint local_166c;
  undefined8 local_1668;
  undefined8 uStack_1660;
  uint local_164c;
  undefined8 local_1648;
  undefined8 uStack_1640;
  uint local_162c;
  undefined8 local_1628;
  undefined8 uStack_1620;
  uint local_160c;
  undefined8 local_1608;
  undefined8 uStack_1600;
  uint local_15ec;
  undefined8 local_15e8;
  undefined8 uStack_15e0;
  uint local_15cc;
  undefined8 local_15c8;
  undefined8 uStack_15c0;
  uint local_15ac;
  undefined8 local_15a8;
  undefined8 uStack_15a0;
  uint local_158c;
  undefined8 local_1588;
  undefined8 uStack_1580;
  uint local_156c;
  undefined8 local_1568;
  undefined8 uStack_1560;
  uint local_154c;
  undefined8 local_1548;
  undefined8 uStack_1540;
  uint local_152c;
  undefined8 local_1528;
  undefined8 uStack_1520;
  uint local_150c;
  undefined8 local_1508;
  undefined8 uStack_1500;
  int local_14f8;
  int iStack_14f4;
  int iStack_14f0;
  int iStack_14ec;
  undefined8 local_14e8;
  undefined8 uStack_14e0;
  int local_14d8;
  int iStack_14d4;
  int iStack_14d0;
  int iStack_14cc;
  undefined8 local_14c8;
  undefined8 uStack_14c0;
  undefined8 local_14b8;
  undefined8 uStack_14b0;
  undefined8 local_14a8;
  undefined8 uStack_14a0;
  int local_1498;
  int iStack_1494;
  int iStack_1490;
  int iStack_148c;
  undefined8 local_1488;
  undefined8 uStack_1480;
  int local_1478;
  int iStack_1474;
  int iStack_1470;
  int iStack_146c;
  undefined8 local_1468;
  undefined8 uStack_1460;
  undefined8 local_1458;
  undefined8 uStack_1450;
  undefined8 local_1448;
  undefined8 uStack_1440;
  int local_1438;
  int iStack_1434;
  int iStack_1430;
  int iStack_142c;
  undefined8 local_1428;
  undefined8 uStack_1420;
  int local_1418;
  int iStack_1414;
  int iStack_1410;
  int iStack_140c;
  undefined8 local_1408;
  undefined8 uStack_1400;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  undefined8 local_13e8;
  undefined8 uStack_13e0;
  int local_13d8;
  int iStack_13d4;
  int iStack_13d0;
  int iStack_13cc;
  undefined8 local_13c8;
  undefined8 uStack_13c0;
  int local_13b8;
  int iStack_13b4;
  int iStack_13b0;
  int iStack_13ac;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  undefined8 local_1398;
  undefined8 uStack_1390;
  undefined8 local_1388;
  undefined8 uStack_1380;
  int local_1378;
  int iStack_1374;
  int iStack_1370;
  int iStack_136c;
  undefined8 local_1368;
  undefined8 uStack_1360;
  int local_1358;
  int iStack_1354;
  int iStack_1350;
  int iStack_134c;
  undefined8 local_1348;
  undefined8 uStack_1340;
  undefined8 local_1338;
  undefined8 uStack_1330;
  undefined8 local_1328;
  undefined8 uStack_1320;
  int local_1318;
  int iStack_1314;
  int iStack_1310;
  int iStack_130c;
  undefined8 local_1308;
  undefined8 uStack_1300;
  int local_12f8;
  int iStack_12f4;
  int iStack_12f0;
  int iStack_12ec;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined8 local_12d8;
  undefined8 uStack_12d0;
  undefined8 local_12c8;
  undefined8 uStack_12c0;
  int local_12b8;
  int iStack_12b4;
  int iStack_12b0;
  int iStack_12ac;
  undefined8 local_12a8;
  undefined8 uStack_12a0;
  int local_1298;
  int iStack_1294;
  int iStack_1290;
  int iStack_128c;
  undefined8 local_1288;
  undefined8 uStack_1280;
  undefined8 local_1278;
  undefined8 uStack_1270;
  undefined8 local_1268;
  undefined8 uStack_1260;
  int local_1258;
  int iStack_1254;
  int iStack_1250;
  int iStack_124c;
  undefined8 local_1248;
  undefined8 uStack_1240;
  int local_1238;
  int iStack_1234;
  int iStack_1230;
  int iStack_122c;
  undefined8 local_1228;
  undefined8 uStack_1220;
  undefined8 local_1218;
  undefined8 uStack_1210;
  undefined8 local_1208;
  undefined8 uStack_1200;
  int local_11f8;
  int iStack_11f4;
  int iStack_11f0;
  int iStack_11ec;
  undefined8 local_11e8;
  undefined8 uStack_11e0;
  int local_11d8;
  int iStack_11d4;
  int iStack_11d0;
  int iStack_11cc;
  undefined8 local_11c8;
  undefined8 uStack_11c0;
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  undefined8 local_11a8;
  undefined8 uStack_11a0;
  int local_1198;
  int iStack_1194;
  int iStack_1190;
  int iStack_118c;
  undefined8 local_1188;
  undefined8 uStack_1180;
  int local_1178;
  int iStack_1174;
  int iStack_1170;
  int iStack_116c;
  undefined8 local_1168;
  undefined8 uStack_1160;
  undefined8 local_1158;
  undefined8 uStack_1150;
  undefined8 local_1148;
  undefined8 uStack_1140;
  int local_1138;
  int iStack_1134;
  int iStack_1130;
  int iStack_112c;
  undefined8 local_1128;
  undefined8 uStack_1120;
  int local_1118;
  int iStack_1114;
  int iStack_1110;
  int iStack_110c;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  int local_10d8;
  int iStack_10d4;
  int iStack_10d0;
  int iStack_10cc;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  int local_10b8;
  int iStack_10b4;
  int iStack_10b0;
  int iStack_10ac;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  undefined8 local_1098;
  undefined8 uStack_1090;
  undefined8 local_1088;
  undefined8 uStack_1080;
  int local_1078;
  int iStack_1074;
  int iStack_1070;
  int iStack_106c;
  undefined8 local_1068;
  undefined8 uStack_1060;
  int local_1058;
  int iStack_1054;
  int iStack_1050;
  int iStack_104c;
  undefined8 local_1048;
  undefined8 uStack_1040;
  int local_1038;
  int iStack_1034;
  int iStack_1030;
  int iStack_102c;
  undefined8 local_1028;
  undefined8 uStack_1020;
  int local_1018;
  int iStack_1014;
  int iStack_1010;
  int iStack_100c;
  undefined8 local_1008;
  undefined8 uStack_1000;
  int local_ff8;
  int iStack_ff4;
  int iStack_ff0;
  int iStack_fec;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  int local_fd8;
  int iStack_fd4;
  int iStack_fd0;
  int iStack_fcc;
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  int local_fb8;
  int iStack_fb4;
  int iStack_fb0;
  int iStack_fac;
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  int local_f98;
  int iStack_f94;
  int iStack_f90;
  int iStack_f8c;
  undefined8 local_f88;
  undefined8 uStack_f80;
  int local_f78;
  int iStack_f74;
  int iStack_f70;
  int iStack_f6c;
  undefined8 local_f68;
  undefined8 uStack_f60;
  int local_f58;
  int iStack_f54;
  int iStack_f50;
  int iStack_f4c;
  undefined8 local_f48;
  undefined8 uStack_f40;
  int local_f38;
  int iStack_f34;
  int iStack_f30;
  int iStack_f2c;
  undefined8 local_f28;
  undefined8 uStack_f20;
  int local_f18;
  int iStack_f14;
  int iStack_f10;
  int iStack_f0c;
  undefined8 local_f08;
  undefined8 uStack_f00;
  int local_ef8;
  int iStack_ef4;
  int iStack_ef0;
  int iStack_eec;
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  int local_ed8;
  int iStack_ed4;
  int iStack_ed0;
  int iStack_ecc;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  int local_eb8;
  int iStack_eb4;
  int iStack_eb0;
  int iStack_eac;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  int local_e98;
  int iStack_e94;
  int iStack_e90;
  int iStack_e8c;
  undefined8 local_e88;
  undefined8 uStack_e80;
  int local_e58;
  int iStack_e54;
  int iStack_e50;
  int iStack_e4c;
  int local_db8;
  int iStack_db4;
  int iStack_db0;
  int iStack_dac;
  int local_d98;
  int iStack_d94;
  int iStack_d90;
  int iStack_d8c;
  int local_d88;
  int iStack_d84;
  int iStack_d80;
  int iStack_d7c;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 local_d68;
  undefined8 uStack_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  int local_b64;
  int local_b60;
  int local_b5c;
  int local_b58;
  int local_b54;
  int32_t local_b50;
  int local_b4c;
  int32_t local_b48;
  int32_t local_b44;
  int local_b40;
  int local_b3c;
  int32_t local_b38;
  int32_t local_b34;
  int32_t local_b30;
  int32_t local_b2c;
  int32_t local_b28;
  int32_t local_b24;
  int32_t local_b20;
  int32_t local_b1c;
  int32_t local_b18;
  int32_t local_b14;
  int32_t local_b10;
  int32_t local_b0c;
  int32_t local_b08;
  int32_t local_b04;
  int32_t local_b00;
  int32_t local_afc;
  int32_t local_af8;
  int32_t local_af4;
  int32_t local_af0;
  int32_t local_aec;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  int32_t local_3d8;
  int32_t local_3d4;
  int32_t local_3d0;
  int32_t local_3cc;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  int32_t local_3b8;
  int32_t local_3b4;
  int32_t local_3b0;
  int32_t local_3ac;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  int32_t local_398;
  int32_t local_394;
  int32_t local_390;
  int32_t local_38c;
  undefined8 local_388;
  undefined8 uStack_380;
  int32_t local_378;
  int32_t local_374;
  int32_t local_370;
  int32_t local_36c;
  undefined8 local_368;
  undefined8 uStack_360;
  int32_t local_358;
  int32_t local_354;
  int32_t local_350;
  int32_t local_34c;
  undefined8 local_348;
  undefined8 uStack_340;
  int32_t local_338;
  int32_t local_334;
  int32_t local_330;
  int32_t local_32c;
  undefined8 local_328;
  undefined8 uStack_320;
  int32_t local_318;
  int32_t local_314;
  int32_t local_310;
  int32_t local_30c;
  undefined8 local_308;
  undefined8 uStack_300;
  int32_t local_2f8;
  int32_t local_2f4;
  int32_t local_2f0;
  int32_t local_2ec;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  int32_t local_2d8;
  int32_t local_2d4;
  int32_t local_2d0;
  int32_t local_2cc;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  int32_t local_2b8;
  int32_t local_2b4;
  int32_t local_2b0;
  int32_t local_2ac;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  int32_t local_298;
  int32_t local_294;
  int32_t local_290;
  int32_t local_28c;
  undefined8 local_288;
  undefined8 uStack_280;
  int32_t local_278;
  int32_t local_274;
  int32_t local_270;
  int32_t local_26c;
  undefined8 local_268;
  undefined8 uStack_260;
  int32_t local_258;
  int32_t local_254;
  int32_t local_250;
  int32_t local_24c;
  undefined8 local_248;
  undefined8 uStack_240;
  int32_t local_238;
  int32_t local_234;
  int32_t local_230;
  int32_t local_22c;
  undefined8 local_228;
  undefined8 uStack_220;
  int32_t local_218;
  int32_t local_214;
  int32_t local_210;
  int32_t local_20c;
  undefined8 local_208;
  undefined8 uStack_200;
  int32_t local_1f8;
  int32_t local_1f4;
  int32_t local_1f0;
  int32_t local_1ec;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  int32_t local_1d8;
  int32_t local_1d4;
  int32_t local_1d0;
  int32_t local_1cc;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  int32_t local_1b8;
  int32_t local_1b4;
  int32_t local_1b0;
  int32_t local_1ac;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  int32_t local_198;
  int32_t local_194;
  int32_t local_190;
  int32_t local_18c;
  undefined8 local_188;
  undefined8 uStack_180;
  int32_t local_178;
  int32_t local_174;
  int32_t local_170;
  int32_t local_16c;
  undefined8 local_168;
  undefined8 uStack_160;
  int local_158;
  int local_154;
  int local_150;
  int local_14c;
  undefined8 local_148;
  undefined8 uStack_140;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  undefined8 local_128;
  undefined8 uStack_120;
  int32_t local_118;
  int32_t local_114;
  int32_t local_110;
  int32_t local_10c;
  undefined8 local_108;
  undefined8 uStack_100;
  int32_t local_f8;
  int32_t local_f4;
  int32_t local_f0;
  int32_t local_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  int32_t local_b8;
  int32_t local_b4;
  int32_t local_b0;
  int32_t local_ac;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  
  local_1a0c = (int)in_R8;
  local_1a10 = in_R9D;
  local_1a08 = in_ECX;
  local_1a04 = in_EDX;
  local_1a00 = in_RSI;
  local_19f8 = in_RDI;
  local_1a18 = cospi_arr(in_EDX);
  local_aec = local_1a18[2];
  local_1a28 = CONCAT44(local_aec,local_aec);
  uStack_1a20 = CONCAT44(local_aec,local_aec);
  local_af0 = local_1a18[0x3e];
  local_1a38 = CONCAT44(local_af0,local_af0);
  uStack_1a30 = CONCAT44(local_af0,local_af0);
  local_af4 = local_1a18[10];
  local_1a48 = CONCAT44(local_af4,local_af4);
  uStack_1a40 = CONCAT44(local_af4,local_af4);
  local_af8 = local_1a18[0x36];
  local_1a58 = CONCAT44(local_af8,local_af8);
  uStack_1a50 = CONCAT44(local_af8,local_af8);
  local_afc = local_1a18[0x12];
  local_1a68 = CONCAT44(local_afc,local_afc);
  uStack_1a60 = CONCAT44(local_afc,local_afc);
  local_b00 = local_1a18[0x2e];
  local_1a78 = CONCAT44(local_b00,local_b00);
  uStack_1a70 = CONCAT44(local_b00,local_b00);
  local_b04 = local_1a18[0x1a];
  local_1a88 = CONCAT44(local_b04,local_b04);
  uStack_1a80 = CONCAT44(local_b04,local_b04);
  local_b08 = local_1a18[0x26];
  local_1a98 = CONCAT44(local_b08,local_b08);
  uStack_1a90 = CONCAT44(local_b08,local_b08);
  local_b0c = local_1a18[0x22];
  local_1aa8 = CONCAT44(local_b0c,local_b0c);
  uStack_1aa0 = CONCAT44(local_b0c,local_b0c);
  local_b10 = local_1a18[0x1e];
  local_1ab8 = CONCAT44(local_b10,local_b10);
  uStack_1ab0 = CONCAT44(local_b10,local_b10);
  local_b14 = local_1a18[0x2a];
  local_1ac8 = CONCAT44(local_b14,local_b14);
  uStack_1ac0 = CONCAT44(local_b14,local_b14);
  local_b18 = local_1a18[0x16];
  local_1ad8 = CONCAT44(local_b18,local_b18);
  uStack_1ad0 = CONCAT44(local_b18,local_b18);
  local_b1c = local_1a18[0x32];
  local_1ae8 = CONCAT44(local_b1c,local_b1c);
  uStack_1ae0 = CONCAT44(local_b1c,local_b1c);
  local_b20 = local_1a18[0xe];
  local_1af8 = CONCAT44(local_b20,local_b20);
  uStack_1af0 = CONCAT44(local_b20,local_b20);
  local_b24 = local_1a18[0x3a];
  local_1b08 = CONCAT44(local_b24,local_b24);
  uStack_1b00 = CONCAT44(local_b24,local_b24);
  local_b28 = local_1a18[6];
  local_1b18 = CONCAT44(local_b28,local_b28);
  uStack_1b10 = CONCAT44(local_b28,local_b28);
  local_b2c = local_1a18[8];
  local_1b28 = CONCAT44(local_b2c,local_b2c);
  uStack_1b20 = CONCAT44(local_b2c,local_b2c);
  local_b30 = local_1a18[0x38];
  local_1b38 = CONCAT44(local_b30,local_b30);
  uStack_1b30 = CONCAT44(local_b30,local_b30);
  local_b34 = local_1a18[0x28];
  local_1b48 = CONCAT44(local_b34,local_b34);
  uStack_1b40 = CONCAT44(local_b34,local_b34);
  local_b38 = local_1a18[0x18];
  local_1b58 = CONCAT44(local_b38,local_b38);
  uStack_1b50 = CONCAT44(local_b38,local_b38);
  local_b3c = -local_1a18[0x38];
  local_1b68 = CONCAT44(local_b3c,local_b3c);
  uStack_1b60 = CONCAT44(local_b3c,local_b3c);
  local_b40 = -local_1a18[0x18];
  local_1b78 = CONCAT44(local_b40,local_b40);
  uStack_1b70 = CONCAT44(local_b40,local_b40);
  local_b44 = local_1a18[0x30];
  local_1b88 = CONCAT44(local_b44,local_b44);
  uStack_1b80 = CONCAT44(local_b44,local_b44);
  local_b48 = local_1a18[0x10];
  local_1b98 = CONCAT44(local_b48,local_b48);
  uStack_1b90 = CONCAT44(local_b48,local_b48);
  local_b4c = -local_1a18[0x30];
  local_1ba8 = CONCAT44(local_b4c,local_b4c);
  uStack_1ba0 = CONCAT44(local_b4c,local_b4c);
  local_b50 = local_1a18[0x20];
  local_1bb8 = CONCAT44(local_b50,local_b50);
  uStack_1bb0 = CONCAT44(local_b50,local_b50);
  local_b54 = 1 << ((char)local_1a04 - 1U & 0x1f);
  iVar97 = 8;
  if (local_1a08 != 0) {
    iVar97 = 6;
  }
  if (local_1a0c + iVar97 < 0x10) {
    iVar97 = 0x10;
  }
  else {
    iVar97 = 8;
    if (local_1a08 != 0) {
      iVar97 = 6;
    }
    iVar97 = local_1a0c + iVar97;
  }
  local_1bcc._0_1_ = (char)iVar97;
  local_b58 = -(1 << ((char)local_1bcc - 1U & 0x1f));
  local_1be8 = CONCAT44(local_b58,local_b58);
  uStack_1be0 = CONCAT44(local_b58,local_b58);
  local_b5c = (1 << ((char)local_1bcc - 1U & 0x1f)) + -1;
  local_1bf8 = CONCAT44(local_b5c,local_b5c);
  uStack_1bf0 = CONCAT44(local_b5c,local_b5c);
  local_b78 = 0;
  uStack_b70 = 0;
  local_1c08 = 0;
  uStack_1c00 = 0;
  local_3f8 = *(undefined8 *)*local_19f8;
  uStack_3f0 = *(undefined8 *)(*local_19f8 + 8);
  auVar60._8_8_ = uStack_1a30;
  auVar60._0_8_ = local_1a38;
  auVar92 = pmulld(*local_19f8,auVar60);
  local_1d18._0_8_ = auVar92._0_8_;
  local_1d18._8_8_ = auVar92._8_8_;
  local_e88 = local_1d18._0_8_;
  uVar82 = local_e88;
  uStack_e80 = local_1d18._8_8_;
  uVar83 = uStack_e80;
  local_e88._0_4_ = auVar92._0_4_;
  local_e88._4_4_ = auVar92._4_4_;
  uStack_e80._0_4_ = auVar92._8_4_;
  uStack_e80._4_4_ = auVar92._12_4_;
  local_1508 = CONCAT44(local_e88._4_4_ + local_b54,(int)local_e88 + local_b54);
  uStack_1500 = CONCAT44(uStack_e80._4_4_ + local_b54,(int)uStack_e80 + local_b54);
  local_150c = local_1a04;
  auVar92 = ZEXT416(local_1a04);
  local_1d08 = (int)local_e88 + local_b54 >> auVar92;
  iStack_1d04 = local_e88._4_4_ + local_b54 >> auVar92;
  iStack_1d00 = (int)uStack_e80 + local_b54 >> auVar92;
  iStack_1cfc = uStack_e80._4_4_ + local_b54 >> auVar92;
  local_418 = *(undefined8 *)*local_19f8;
  uStack_410 = *(undefined8 *)(*local_19f8 + 8);
  auVar59._8_8_ = uStack_1a20;
  auVar59._0_8_ = local_1a28;
  auVar92 = pmulld(*local_19f8,auVar59);
  local_1d18._0_8_ = auVar92._0_8_;
  local_1d18._8_8_ = auVar92._8_8_;
  local_b88 = 0;
  uStack_b80 = 0;
  local_b98 = local_1d18._0_8_;
  uVar90 = local_b98;
  uStack_b90 = local_1d18._8_8_;
  uVar91 = uStack_b90;
  local_b98._0_4_ = auVar92._0_4_;
  local_b98._4_4_ = auVar92._4_4_;
  uStack_b90._0_4_ = auVar92._8_4_;
  uStack_b90._4_4_ = auVar92._12_4_;
  local_ea8 = CONCAT44(-local_b98._4_4_,-(int)local_b98);
  uStack_ea0 = CONCAT44(-uStack_b90._4_4_,-(int)uStack_b90);
  local_1cf8 = -(int)local_b98 + local_b54;
  iStack_1cf4 = -local_b98._4_4_ + local_b54;
  iStack_1cf0 = -(int)uStack_b90 + local_b54;
  iStack_1cec = -uStack_b90._4_4_ + local_b54;
  local_1528 = CONCAT44(iStack_1cf4,local_1cf8);
  uStack_1520 = CONCAT44(iStack_1cec,iStack_1cf0);
  local_152c = local_1a04;
  auVar92 = ZEXT416(local_1a04);
  local_1cf8 = local_1cf8 >> auVar92;
  iStack_1cf4 = iStack_1cf4 >> auVar92;
  iStack_1cf0 = iStack_1cf0 >> auVar92;
  iStack_1cec = iStack_1cec >> auVar92;
  local_438 = *(undefined8 *)local_19f8[2];
  uStack_430 = *(undefined8 *)(local_19f8[2] + 8);
  auVar58._8_8_ = uStack_1a50;
  auVar58._0_8_ = local_1a58;
  auVar92 = pmulld(local_19f8[2],auVar58);
  local_1d18._0_8_ = auVar92._0_8_;
  local_1d18._8_8_ = auVar92._8_8_;
  local_ec8 = local_1d18._0_8_;
  uVar80 = local_ec8;
  uStack_ec0 = local_1d18._8_8_;
  uVar81 = uStack_ec0;
  local_ec8._0_4_ = auVar92._0_4_;
  local_ec8._4_4_ = auVar92._4_4_;
  uStack_ec0._0_4_ = auVar92._8_4_;
  uStack_ec0._4_4_ = auVar92._12_4_;
  local_1548 = CONCAT44(local_ec8._4_4_ + local_b54,(int)local_ec8 + local_b54);
  uStack_1540 = CONCAT44(uStack_ec0._4_4_ + local_b54,(int)uStack_ec0 + local_b54);
  local_154c = local_1a04;
  auVar92 = ZEXT416(local_1a04);
  local_1ce8 = (int)local_ec8 + local_b54 >> auVar92;
  iStack_1ce4 = local_ec8._4_4_ + local_b54 >> auVar92;
  iStack_1ce0 = (int)uStack_ec0 + local_b54 >> auVar92;
  iStack_1cdc = uStack_ec0._4_4_ + local_b54 >> auVar92;
  local_458 = *(undefined8 *)local_19f8[2];
  uStack_450 = *(undefined8 *)(local_19f8[2] + 8);
  auVar57._8_8_ = uStack_1a40;
  auVar57._0_8_ = local_1a48;
  auVar92 = pmulld(local_19f8[2],auVar57);
  local_1d18._0_8_ = auVar92._0_8_;
  local_1d18._8_8_ = auVar92._8_8_;
  local_ba8 = 0;
  uStack_ba0 = 0;
  local_bb8 = local_1d18._0_8_;
  uVar88 = local_bb8;
  uStack_bb0 = local_1d18._8_8_;
  uVar89 = uStack_bb0;
  local_bb8._0_4_ = auVar92._0_4_;
  local_bb8._4_4_ = auVar92._4_4_;
  uStack_bb0._0_4_ = auVar92._8_4_;
  uStack_bb0._4_4_ = auVar92._12_4_;
  local_ee8 = CONCAT44(-local_bb8._4_4_,-(int)local_bb8);
  uStack_ee0 = CONCAT44(-uStack_bb0._4_4_,-(int)uStack_bb0);
  local_1cd8 = -(int)local_bb8 + local_b54;
  iStack_1cd4 = -local_bb8._4_4_ + local_b54;
  iStack_1cd0 = -(int)uStack_bb0 + local_b54;
  iStack_1ccc = -uStack_bb0._4_4_ + local_b54;
  local_1568 = CONCAT44(iStack_1cd4,local_1cd8);
  uStack_1560 = CONCAT44(iStack_1ccc,iStack_1cd0);
  local_156c = local_1a04;
  auVar92 = ZEXT416(local_1a04);
  local_1cd8 = local_1cd8 >> auVar92;
  iStack_1cd4 = iStack_1cd4 >> auVar92;
  iStack_1cd0 = iStack_1cd0 >> auVar92;
  iStack_1ccc = iStack_1ccc >> auVar92;
  local_478 = *(undefined8 *)local_19f8[4];
  uStack_470 = *(undefined8 *)(local_19f8[4] + 8);
  auVar56._8_8_ = uStack_1a70;
  auVar56._0_8_ = local_1a78;
  auVar92 = pmulld(local_19f8[4],auVar56);
  local_1d18._0_8_ = auVar92._0_8_;
  local_1d18._8_8_ = auVar92._8_8_;
  local_f08 = local_1d18._0_8_;
  uVar78 = local_f08;
  uStack_f00 = local_1d18._8_8_;
  uVar79 = uStack_f00;
  local_f08._0_4_ = auVar92._0_4_;
  local_f08._4_4_ = auVar92._4_4_;
  uStack_f00._0_4_ = auVar92._8_4_;
  uStack_f00._4_4_ = auVar92._12_4_;
  local_1cc8._4_4_ = local_f08._4_4_ + local_b54;
  local_1cc8._0_4_ = (int)local_f08 + local_b54;
  local_1cc8._8_4_ = (int)uStack_f00 + local_b54;
  local_1cc8._12_4_ = uStack_f00._4_4_ + local_b54;
  local_1588 = local_1cc8._0_8_;
  uStack_1580 = local_1cc8._8_8_;
  local_158c = local_1a04;
  auVar92 = ZEXT416(local_1a04);
  local_1cc8._4_4_ = local_f08._4_4_ + local_b54 >> auVar92;
  local_1cc8._0_4_ = (int)local_f08 + local_b54 >> auVar92;
  local_1cc8._8_4_ = (int)uStack_f00 + local_b54 >> auVar92;
  local_1cc8._12_4_ = uStack_f00._4_4_ + local_b54 >> auVar92;
  local_498 = *(undefined8 *)local_19f8[4];
  uStack_490 = *(undefined8 *)(local_19f8[4] + 8);
  auVar55._8_8_ = uStack_1a60;
  auVar55._0_8_ = local_1a68;
  auVar92 = pmulld(local_19f8[4],auVar55);
  local_1d18._0_8_ = auVar92._0_8_;
  local_1d18._8_8_ = auVar92._8_8_;
  local_bc8 = 0;
  uStack_bc0 = 0;
  local_bd8 = local_1d18._0_8_;
  uVar86 = local_bd8;
  uStack_bd0 = local_1d18._8_8_;
  uVar87 = uStack_bd0;
  local_bd8._0_4_ = auVar92._0_4_;
  local_bd8._4_4_ = auVar92._4_4_;
  uStack_bd0._0_4_ = auVar92._8_4_;
  uStack_bd0._4_4_ = auVar92._12_4_;
  local_f28 = CONCAT44(-local_bd8._4_4_,-(int)local_bd8);
  uStack_f20 = CONCAT44(-uStack_bd0._4_4_,-(int)uStack_bd0);
  local_1cb8 = -(int)local_bd8 + local_b54;
  iStack_1cb4 = -local_bd8._4_4_ + local_b54;
  iStack_1cb0 = -(int)uStack_bd0 + local_b54;
  iStack_1cac = -uStack_bd0._4_4_ + local_b54;
  local_15a8 = CONCAT44(iStack_1cb4,local_1cb8);
  uStack_15a0 = CONCAT44(iStack_1cac,iStack_1cb0);
  local_15ac = local_1a04;
  auVar92 = ZEXT416(local_1a04);
  local_1cb8 = local_1cb8 >> auVar92;
  iStack_1cb4 = iStack_1cb4 >> auVar92;
  iStack_1cb0 = iStack_1cb0 >> auVar92;
  iStack_1cac = iStack_1cac >> auVar92;
  local_4b8 = *(undefined8 *)local_19f8[6];
  uStack_4b0 = *(undefined8 *)(local_19f8[6] + 8);
  auVar54._8_8_ = uStack_1a90;
  auVar54._0_8_ = local_1a98;
  auVar92 = pmulld(local_19f8[6],auVar54);
  local_1d18._0_8_ = auVar92._0_8_;
  local_1d18._8_8_ = auVar92._8_8_;
  local_f48 = local_1d18._0_8_;
  uVar98 = local_f48;
  uStack_f40 = local_1d18._8_8_;
  uVar77 = uStack_f40;
  local_f48._0_4_ = auVar92._0_4_;
  local_f48._4_4_ = auVar92._4_4_;
  uStack_f40._0_4_ = auVar92._8_4_;
  uStack_f40._4_4_ = auVar92._12_4_;
  local_1ca8._4_4_ = local_f48._4_4_ + local_b54;
  local_1ca8._0_4_ = (int)local_f48 + local_b54;
  local_1ca8._8_4_ = (int)uStack_f40 + local_b54;
  local_1ca8._12_4_ = uStack_f40._4_4_ + local_b54;
  local_15c8 = local_1ca8._0_8_;
  uStack_15c0 = local_1ca8._8_8_;
  local_15cc = local_1a04;
  auVar92 = ZEXT416(local_1a04);
  local_1ca8._4_4_ = local_f48._4_4_ + local_b54 >> auVar92;
  local_1ca8._0_4_ = (int)local_f48 + local_b54 >> auVar92;
  local_1ca8._8_4_ = (int)uStack_f40 + local_b54 >> auVar92;
  local_1ca8._12_4_ = uStack_f40._4_4_ + local_b54 >> auVar92;
  local_4d8 = *(undefined8 *)local_19f8[6];
  uStack_4d0 = *(undefined8 *)(local_19f8[6] + 8);
  auVar53._8_8_ = uStack_1a80;
  auVar53._0_8_ = local_1a88;
  local_1d18 = pmulld(local_19f8[6],auVar53);
  local_be8 = 0;
  uStack_be0 = 0;
  local_bf8 = local_1d18._0_8_;
  uVar84 = local_bf8;
  uStack_bf0 = local_1d18._8_8_;
  uVar85 = uStack_bf0;
  local_bf8._0_4_ = local_1d18._0_4_;
  local_bf8._4_4_ = local_1d18._4_4_;
  uStack_bf0._0_4_ = local_1d18._8_4_;
  uStack_bf0._4_4_ = local_1d18._12_4_;
  local_f68 = CONCAT44(-local_bf8._4_4_,-(int)local_bf8);
  uStack_f60 = CONCAT44(-uStack_bf0._4_4_,-(int)uStack_bf0);
  local_1c98 = -(int)local_bf8 + local_b54;
  iStack_1c94 = -local_bf8._4_4_ + local_b54;
  iStack_1c90 = -(int)uStack_bf0 + local_b54;
  iStack_1c8c = -uStack_bf0._4_4_ + local_b54;
  local_15e8 = CONCAT44(iStack_1c94,local_1c98);
  uStack_15e0 = CONCAT44(iStack_1c8c,iStack_1c90);
  local_15ec = local_1a04;
  auVar92 = ZEXT416(local_1a04);
  local_1c98 = local_1c98 >> auVar92;
  iStack_1c94 = iStack_1c94 >> auVar92;
  iStack_1c90 = iStack_1c90 >> auVar92;
  iStack_1c8c = iStack_1c8c >> auVar92;
  local_4f8 = *(undefined8 *)local_19f8[7];
  uStack_4f0 = *(undefined8 *)(local_19f8[7] + 8);
  auVar52._8_8_ = uStack_1aa0;
  auVar52._0_8_ = local_1aa8;
  auVar92 = pmulld(local_19f8[7],auVar52);
  local_1c88._0_8_ = auVar92._0_8_;
  local_1c88._8_8_ = auVar92._8_8_;
  local_f88 = local_1c88._0_8_;
  uVar75 = local_f88;
  uStack_f80 = local_1c88._8_8_;
  uVar76 = uStack_f80;
  local_f88._0_4_ = auVar92._0_4_;
  local_f88._4_4_ = auVar92._4_4_;
  uStack_f80._0_4_ = auVar92._8_4_;
  uStack_f80._4_4_ = auVar92._12_4_;
  local_1c88._4_4_ = local_f88._4_4_ + local_b54;
  local_1c88._0_4_ = (int)local_f88 + local_b54;
  local_1c88._8_4_ = (int)uStack_f80 + local_b54;
  local_1c88._12_4_ = uStack_f80._4_4_ + local_b54;
  local_1608 = local_1c88._0_8_;
  uStack_1600 = local_1c88._8_8_;
  local_160c = local_1a04;
  auVar92 = ZEXT416(local_1a04);
  local_1c88._4_4_ = local_f88._4_4_ + local_b54 >> auVar92;
  local_1c88._0_4_ = (int)local_f88 + local_b54 >> auVar92;
  local_1c88._8_4_ = (int)uStack_f80 + local_b54 >> auVar92;
  local_1c88._12_4_ = uStack_f80._4_4_ + local_b54 >> auVar92;
  local_518 = *(undefined8 *)local_19f8[7];
  uStack_510 = *(undefined8 *)(local_19f8[7] + 8);
  auVar51._8_8_ = uStack_1ab0;
  auVar51._0_8_ = local_1ab8;
  auVar92 = pmulld(local_19f8[7],auVar51);
  local_1c78._0_8_ = auVar92._0_8_;
  local_1c78._8_8_ = auVar92._8_8_;
  local_fa8 = local_1c78._0_8_;
  uVar73 = local_fa8;
  uStack_fa0 = local_1c78._8_8_;
  uVar74 = uStack_fa0;
  local_fa8._0_4_ = auVar92._0_4_;
  local_fa8._4_4_ = auVar92._4_4_;
  uStack_fa0._0_4_ = auVar92._8_4_;
  uStack_fa0._4_4_ = auVar92._12_4_;
  local_1c78._4_4_ = local_fa8._4_4_ + local_b54;
  local_1c78._0_4_ = (int)local_fa8 + local_b54;
  local_1c78._8_4_ = (int)uStack_fa0 + local_b54;
  local_1c78._12_4_ = uStack_fa0._4_4_ + local_b54;
  local_1628 = local_1c78._0_8_;
  uStack_1620 = local_1c78._8_8_;
  local_162c = local_1a04;
  auVar92 = ZEXT416(local_1a04);
  local_1c78._4_4_ = local_fa8._4_4_ + local_b54 >> auVar92;
  local_1c78._0_4_ = (int)local_fa8 + local_b54 >> auVar92;
  local_1c78._8_4_ = (int)uStack_fa0 + local_b54 >> auVar92;
  local_1c78._12_4_ = uStack_fa0._4_4_ + local_b54 >> auVar92;
  local_538 = *(undefined8 *)local_19f8[5];
  uStack_530 = *(undefined8 *)(local_19f8[5] + 8);
  auVar50._8_8_ = uStack_1ac0;
  auVar50._0_8_ = local_1ac8;
  auVar92 = pmulld(local_19f8[5],auVar50);
  local_1c68._0_8_ = auVar92._0_8_;
  local_1c68._8_8_ = auVar92._8_8_;
  local_fc8 = local_1c68._0_8_;
  uVar71 = local_fc8;
  uStack_fc0 = local_1c68._8_8_;
  uVar72 = uStack_fc0;
  local_fc8._0_4_ = auVar92._0_4_;
  local_fc8._4_4_ = auVar92._4_4_;
  uStack_fc0._0_4_ = auVar92._8_4_;
  uStack_fc0._4_4_ = auVar92._12_4_;
  local_1c68._4_4_ = local_fc8._4_4_ + local_b54;
  local_1c68._0_4_ = (int)local_fc8 + local_b54;
  local_1c68._8_4_ = (int)uStack_fc0 + local_b54;
  local_1c68._12_4_ = uStack_fc0._4_4_ + local_b54;
  local_1648 = local_1c68._0_8_;
  uStack_1640 = local_1c68._8_8_;
  local_164c = local_1a04;
  auVar92 = ZEXT416(local_1a04);
  local_1c68._4_4_ = local_fc8._4_4_ + local_b54 >> auVar92;
  local_1c68._0_4_ = (int)local_fc8 + local_b54 >> auVar92;
  local_1c68._8_4_ = (int)uStack_fc0 + local_b54 >> auVar92;
  local_1c68._12_4_ = uStack_fc0._4_4_ + local_b54 >> auVar92;
  local_558 = *(undefined8 *)local_19f8[5];
  uStack_550 = *(undefined8 *)(local_19f8[5] + 8);
  auVar49._8_8_ = uStack_1ad0;
  auVar49._0_8_ = local_1ad8;
  auVar92 = pmulld(local_19f8[5],auVar49);
  local_1c58._0_8_ = auVar92._0_8_;
  local_1c58._8_8_ = auVar92._8_8_;
  local_fe8 = local_1c58._0_8_;
  uVar69 = local_fe8;
  uStack_fe0 = local_1c58._8_8_;
  uVar70 = uStack_fe0;
  local_fe8._0_4_ = auVar92._0_4_;
  local_fe8._4_4_ = auVar92._4_4_;
  uStack_fe0._0_4_ = auVar92._8_4_;
  uStack_fe0._4_4_ = auVar92._12_4_;
  local_1c58._4_4_ = local_fe8._4_4_ + local_b54;
  local_1c58._0_4_ = (int)local_fe8 + local_b54;
  local_1c58._8_4_ = (int)uStack_fe0 + local_b54;
  local_1c58._12_4_ = uStack_fe0._4_4_ + local_b54;
  local_1668 = local_1c58._0_8_;
  uStack_1660 = local_1c58._8_8_;
  local_166c = local_1a04;
  auVar92 = ZEXT416(local_1a04);
  local_1c58._4_4_ = local_fe8._4_4_ + local_b54 >> auVar92;
  local_1c58._0_4_ = (int)local_fe8 + local_b54 >> auVar92;
  local_1c58._8_4_ = (int)uStack_fe0 + local_b54 >> auVar92;
  local_1c58._12_4_ = uStack_fe0._4_4_ + local_b54 >> auVar92;
  local_578 = *(undefined8 *)local_19f8[3];
  uStack_570 = *(undefined8 *)(local_19f8[3] + 8);
  auVar48._8_8_ = uStack_1ae0;
  auVar48._0_8_ = local_1ae8;
  auVar92 = pmulld(local_19f8[3],auVar48);
  local_1c48._0_8_ = auVar92._0_8_;
  local_1c48._8_8_ = auVar92._8_8_;
  local_1008 = local_1c48._0_8_;
  uVar67 = local_1008;
  uStack_1000 = local_1c48._8_8_;
  uVar68 = uStack_1000;
  local_1008._0_4_ = auVar92._0_4_;
  local_1008._4_4_ = auVar92._4_4_;
  uStack_1000._0_4_ = auVar92._8_4_;
  uStack_1000._4_4_ = auVar92._12_4_;
  local_1c48._4_4_ = local_1008._4_4_ + local_b54;
  local_1c48._0_4_ = (int)local_1008 + local_b54;
  local_1c48._8_4_ = (int)uStack_1000 + local_b54;
  local_1c48._12_4_ = uStack_1000._4_4_ + local_b54;
  local_1688 = local_1c48._0_8_;
  uStack_1680 = local_1c48._8_8_;
  local_168c = local_1a04;
  auVar92 = ZEXT416(local_1a04);
  local_1c48._4_4_ = local_1008._4_4_ + local_b54 >> auVar92;
  local_1c48._0_4_ = (int)local_1008 + local_b54 >> auVar92;
  local_1c48._8_4_ = (int)uStack_1000 + local_b54 >> auVar92;
  local_1c48._12_4_ = uStack_1000._4_4_ + local_b54 >> auVar92;
  local_598 = *(undefined8 *)local_19f8[3];
  uStack_590 = *(undefined8 *)(local_19f8[3] + 8);
  auVar47._8_8_ = uStack_1af0;
  auVar47._0_8_ = local_1af8;
  auVar92 = pmulld(local_19f8[3],auVar47);
  local_1c38._0_8_ = auVar92._0_8_;
  local_1c38._8_8_ = auVar92._8_8_;
  local_1028 = local_1c38._0_8_;
  uVar65 = local_1028;
  uStack_1020 = local_1c38._8_8_;
  uVar66 = uStack_1020;
  local_1028._0_4_ = auVar92._0_4_;
  local_1028._4_4_ = auVar92._4_4_;
  uStack_1020._0_4_ = auVar92._8_4_;
  uStack_1020._4_4_ = auVar92._12_4_;
  local_1c38._4_4_ = local_1028._4_4_ + local_b54;
  local_1c38._0_4_ = (int)local_1028 + local_b54;
  local_1c38._8_4_ = (int)uStack_1020 + local_b54;
  local_1c38._12_4_ = uStack_1020._4_4_ + local_b54;
  local_16a8 = local_1c38._0_8_;
  uStack_16a0 = local_1c38._8_8_;
  local_16ac = local_1a04;
  auVar92 = ZEXT416(local_1a04);
  local_1c38._4_4_ = local_1028._4_4_ + local_b54 >> auVar92;
  local_1c38._0_4_ = (int)local_1028 + local_b54 >> auVar92;
  local_1c38._8_4_ = (int)uStack_1020 + local_b54 >> auVar92;
  local_1c38._12_4_ = uStack_1020._4_4_ + local_b54 >> auVar92;
  local_5b8 = *(undefined8 *)local_19f8[1];
  uStack_5b0 = *(undefined8 *)(local_19f8[1] + 8);
  auVar46._8_8_ = uStack_1b00;
  auVar46._0_8_ = local_1b08;
  auVar92 = pmulld(local_19f8[1],auVar46);
  local_1c28._0_8_ = auVar92._0_8_;
  local_1c28._8_8_ = auVar92._8_8_;
  local_1048 = local_1c28._0_8_;
  uVar63 = local_1048;
  uStack_1040 = local_1c28._8_8_;
  uVar64 = uStack_1040;
  local_1048._0_4_ = auVar92._0_4_;
  local_1048._4_4_ = auVar92._4_4_;
  uStack_1040._0_4_ = auVar92._8_4_;
  uStack_1040._4_4_ = auVar92._12_4_;
  local_1c28._4_4_ = local_1048._4_4_ + local_b54;
  local_1c28._0_4_ = (int)local_1048 + local_b54;
  local_1c28._8_4_ = (int)uStack_1040 + local_b54;
  local_1c28._12_4_ = uStack_1040._4_4_ + local_b54;
  local_16c8 = local_1c28._0_8_;
  uStack_16c0 = local_1c28._8_8_;
  local_16cc = local_1a04;
  auVar92 = ZEXT416(local_1a04);
  local_1c28._4_4_ = local_1048._4_4_ + local_b54 >> auVar92;
  local_1c28._0_4_ = (int)local_1048 + local_b54 >> auVar92;
  local_1c28._8_4_ = (int)uStack_1040 + local_b54 >> auVar92;
  local_1c28._12_4_ = uStack_1040._4_4_ + local_b54 >> auVar92;
  local_5d8 = *(undefined8 *)local_19f8[1];
  uStack_5d0 = *(undefined8 *)(local_19f8[1] + 8);
  auVar45._8_8_ = uStack_1b10;
  auVar45._0_8_ = local_1b18;
  auVar92 = pmulld(local_19f8[1],auVar45);
  local_1c18._0_8_ = auVar92._0_8_;
  local_1c18._8_8_ = auVar92._8_8_;
  local_1068 = local_1c18._0_8_;
  uVar61 = local_1068;
  uStack_1060 = local_1c18._8_8_;
  uVar62 = uStack_1060;
  local_1068._0_4_ = auVar92._0_4_;
  local_1068._4_4_ = auVar92._4_4_;
  uStack_1060._0_4_ = auVar92._8_4_;
  uStack_1060._4_4_ = auVar92._12_4_;
  local_1c18._4_4_ = local_1068._4_4_ + local_b54;
  local_1c18._0_4_ = (int)local_1068 + local_b54;
  local_1c18._8_4_ = (int)uStack_1060 + local_b54;
  local_1c18._12_4_ = uStack_1060._4_4_ + local_b54;
  local_16e8 = local_1c18._0_8_;
  uStack_16e0 = local_1c18._8_8_;
  local_16ec = local_1a04;
  auVar92 = ZEXT416(local_1a04);
  local_1c18._4_4_ = local_1068._4_4_ + local_b54 >> auVar92;
  local_1c18._0_4_ = (int)local_1068 + local_b54 >> auVar92;
  local_1c18._8_4_ = (int)uStack_1060 + local_b54 >> auVar92;
  local_1c18._12_4_ = uStack_1060._4_4_ + local_b54 >> auVar92;
  in0[1] = local_1c88;
  in0[0] = (longlong)&local_1d08;
  in1[1] = (longlong)&local_1bf8;
  in1[0] = (longlong)&local_1be8;
  local_1bcc = iVar97;
  local_1068 = uVar61;
  uStack_1060 = uVar62;
  local_1048 = uVar63;
  uStack_1040 = uVar64;
  local_1028 = uVar65;
  uStack_1020 = uVar66;
  local_1008 = uVar67;
  uStack_1000 = uVar68;
  local_fe8 = uVar69;
  uStack_fe0 = uVar70;
  local_fc8 = uVar71;
  uStack_fc0 = uVar72;
  local_fa8 = uVar73;
  uStack_fa0 = uVar74;
  local_f88 = uVar75;
  uStack_f80 = uVar76;
  local_f48 = uVar98;
  uStack_f40 = uVar77;
  local_f08 = uVar78;
  uStack_f00 = uVar79;
  local_ec8 = uVar80;
  uStack_ec0 = uVar81;
  local_e88 = uVar82;
  uStack_e80 = uVar83;
  local_bf8 = uVar84;
  uStack_bf0 = uVar85;
  local_bd8 = uVar86;
  uStack_bd0 = uVar87;
  local_bb8 = uVar88;
  uStack_bb0 = uVar89;
  local_b98 = uVar90;
  uStack_b90 = uVar91;
  local_5e8 = local_1b18;
  uStack_5e0 = uStack_1b10;
  local_5c8 = local_1b08;
  uStack_5c0 = uStack_1b00;
  local_5a8 = local_1af8;
  uStack_5a0 = uStack_1af0;
  local_588 = local_1ae8;
  uStack_580 = uStack_1ae0;
  local_568 = local_1ad8;
  uStack_560 = uStack_1ad0;
  local_548 = local_1ac8;
  uStack_540 = uStack_1ac0;
  local_528 = local_1ab8;
  uStack_520 = uStack_1ab0;
  local_508 = local_1aa8;
  uStack_500 = uStack_1aa0;
  local_4e8 = local_1a88;
  uStack_4e0 = uStack_1a80;
  local_4c8 = local_1a98;
  uStack_4c0 = uStack_1a90;
  local_4a8 = local_1a68;
  uStack_4a0 = uStack_1a60;
  local_488 = local_1a78;
  uStack_480 = uStack_1a70;
  local_468 = local_1a48;
  uStack_460 = uStack_1a40;
  local_448 = local_1a58;
  uStack_440 = uStack_1a50;
  local_428 = local_1a28;
  uStack_420 = uStack_1a20;
  local_408 = local_1a38;
  uStack_400 = uStack_1a30;
  local_3e8 = local_1a28;
  uStack_3e0 = uStack_1a20;
  local_3d8 = local_aec;
  local_3d4 = local_aec;
  local_3d0 = local_aec;
  local_3cc = local_aec;
  local_3c8 = local_1a38;
  uStack_3c0 = uStack_1a30;
  local_3b8 = local_af0;
  local_3b4 = local_af0;
  local_3b0 = local_af0;
  local_3ac = local_af0;
  local_3a8 = local_1a48;
  uStack_3a0 = uStack_1a40;
  local_398 = local_af4;
  local_394 = local_af4;
  local_390 = local_af4;
  local_38c = local_af4;
  local_388 = local_1a58;
  uStack_380 = uStack_1a50;
  local_378 = local_af8;
  local_374 = local_af8;
  local_370 = local_af8;
  local_36c = local_af8;
  local_368 = local_1a68;
  uStack_360 = uStack_1a60;
  local_358 = local_afc;
  local_354 = local_afc;
  local_350 = local_afc;
  local_34c = local_afc;
  local_348 = local_1a78;
  uStack_340 = uStack_1a70;
  local_338 = local_b00;
  local_334 = local_b00;
  local_330 = local_b00;
  local_32c = local_b00;
  local_328 = local_1a88;
  uStack_320 = uStack_1a80;
  local_318 = local_b04;
  local_314 = local_b04;
  local_310 = local_b04;
  local_30c = local_b04;
  local_308 = local_1a98;
  uStack_300 = uStack_1a90;
  local_2f8 = local_b08;
  local_2f4 = local_b08;
  local_2f0 = local_b08;
  local_2ec = local_b08;
  local_2e8 = local_1aa8;
  uStack_2e0 = uStack_1aa0;
  local_2d8 = local_b0c;
  local_2d4 = local_b0c;
  local_2d0 = local_b0c;
  local_2cc = local_b0c;
  local_2c8 = local_1ab8;
  uStack_2c0 = uStack_1ab0;
  local_2b8 = local_b10;
  local_2b4 = local_b10;
  local_2b0 = local_b10;
  local_2ac = local_b10;
  local_2a8 = local_1ac8;
  uStack_2a0 = uStack_1ac0;
  local_298 = local_b14;
  local_294 = local_b14;
  local_290 = local_b14;
  local_28c = local_b14;
  local_288 = local_1ad8;
  uStack_280 = uStack_1ad0;
  local_278 = local_b18;
  local_274 = local_b18;
  local_270 = local_b18;
  local_26c = local_b18;
  local_268 = local_1ae8;
  uStack_260 = uStack_1ae0;
  local_258 = local_b1c;
  local_254 = local_b1c;
  local_250 = local_b1c;
  local_24c = local_b1c;
  local_248 = local_1af8;
  uStack_240 = uStack_1af0;
  local_238 = local_b20;
  local_234 = local_b20;
  local_230 = local_b20;
  local_22c = local_b20;
  local_228 = local_1b08;
  uStack_220 = uStack_1b00;
  local_218 = local_b24;
  local_214 = local_b24;
  local_210 = local_b24;
  local_20c = local_b24;
  local_208 = local_1b18;
  uStack_200 = uStack_1b10;
  local_1f8 = local_b28;
  local_1f4 = local_b28;
  local_1f0 = local_b28;
  local_1ec = local_b28;
  local_1e8 = local_1b28;
  uStack_1e0 = uStack_1b20;
  local_1d8 = local_b2c;
  local_1d4 = local_b2c;
  local_1d0 = local_b2c;
  local_1cc = local_b2c;
  local_1c8 = local_1b38;
  uStack_1c0 = uStack_1b30;
  local_1b8 = local_b30;
  local_1b4 = local_b30;
  local_1b0 = local_b30;
  local_1ac = local_b30;
  local_1a8 = local_1b48;
  uStack_1a0 = uStack_1b40;
  local_198 = local_b34;
  local_194 = local_b34;
  local_190 = local_b34;
  local_18c = local_b34;
  local_188 = local_1b58;
  uStack_180 = uStack_1b50;
  local_178 = local_b38;
  local_174 = local_b38;
  local_170 = local_b38;
  local_16c = local_b38;
  local_168 = local_1b68;
  uStack_160 = uStack_1b60;
  local_158 = local_b3c;
  local_154 = local_b3c;
  local_150 = local_b3c;
  local_14c = local_b3c;
  local_148 = local_1b78;
  uStack_140 = uStack_1b70;
  local_138 = local_b40;
  local_134 = local_b40;
  local_130 = local_b40;
  local_12c = local_b40;
  local_128 = local_1b88;
  uStack_120 = uStack_1b80;
  local_118 = local_b44;
  local_114 = local_b44;
  local_110 = local_b44;
  local_10c = local_b44;
  local_108 = local_1b98;
  uStack_100 = uStack_1b90;
  local_f8 = local_b48;
  local_f4 = local_b48;
  local_f0 = local_b48;
  local_ec = local_b48;
  local_e8 = local_1ba8;
  uStack_e0 = uStack_1ba0;
  local_d8 = local_b4c;
  local_d4 = local_b4c;
  local_d0 = local_b4c;
  local_cc = local_b4c;
  local_c8 = local_1bb8;
  uStack_c0 = uStack_1bb0;
  local_b8 = local_b50;
  local_b4 = local_b50;
  local_b0 = local_b50;
  local_ac = local_b50;
  local_98 = local_b54;
  local_94 = local_b54;
  local_90 = local_b54;
  local_8c = local_b54;
  local_88 = local_1be8;
  uStack_80 = uStack_1be0;
  local_78 = local_b58;
  local_74 = local_b58;
  local_70 = local_b58;
  local_6c = local_b58;
  local_68 = local_1bf8;
  uStack_60 = uStack_1bf0;
  local_58 = local_b5c;
  local_54 = local_b5c;
  local_50 = local_b5c;
  local_4c = local_b5c;
  local_1bc8 = local_b54;
  iStack_1bc4 = local_b54;
  local_1078 = local_b54;
  iStack_1074 = local_b54;
  local_1058 = local_b54;
  iStack_1054 = local_b54;
  local_1038 = local_b54;
  iStack_1034 = local_b54;
  local_1018 = local_b54;
  iStack_1014 = local_b54;
  local_ff8 = local_b54;
  iStack_ff4 = local_b54;
  local_fd8 = local_b54;
  iStack_fd4 = local_b54;
  local_fb8 = local_b54;
  iStack_fb4 = local_b54;
  local_f98 = local_b54;
  iStack_f94 = local_b54;
  local_f78 = local_b54;
  iStack_f74 = local_b54;
  local_f58 = local_b54;
  iStack_f54 = local_b54;
  local_f38 = local_b54;
  iStack_f34 = local_b54;
  local_f18 = local_b54;
  iStack_f14 = local_b54;
  local_ef8 = local_b54;
  iStack_ef4 = local_b54;
  local_ed8 = local_b54;
  iStack_ed4 = local_b54;
  local_eb8 = local_b54;
  iStack_eb4 = local_b54;
  local_e98 = local_b54;
  iStack_e94 = local_b54;
  local_a8 = local_b54;
  iStack_a4 = local_b54;
  iStack_1bc0 = local_b54;
  iStack_1bbc = local_b54;
  iStack_1070 = local_b54;
  iStack_106c = local_b54;
  iStack_1050 = local_b54;
  iStack_104c = local_b54;
  iStack_1030 = local_b54;
  iStack_102c = local_b54;
  iStack_1010 = local_b54;
  iStack_100c = local_b54;
  iStack_ff0 = local_b54;
  iStack_fec = local_b54;
  iStack_fd0 = local_b54;
  iStack_fcc = local_b54;
  iStack_fb0 = local_b54;
  iStack_fac = local_b54;
  iStack_f90 = local_b54;
  iStack_f8c = local_b54;
  iStack_f70 = local_b54;
  iStack_f6c = local_b54;
  iStack_f50 = local_b54;
  iStack_f4c = local_b54;
  iStack_f30 = local_b54;
  iStack_f2c = local_b54;
  iStack_f10 = local_b54;
  iStack_f0c = local_b54;
  iStack_ef0 = local_b54;
  iStack_eec = local_b54;
  iStack_ed0 = local_b54;
  iStack_ecc = local_b54;
  iStack_eb0 = local_b54;
  iStack_eac = local_b54;
  iStack_e90 = local_b54;
  iStack_e8c = local_b54;
  iStack_a0 = local_b54;
  iStack_9c = local_b54;
  addsub_sse4_1(in0,in1,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                in_stack_ffffffffffffe298,(__m128i *)CONCAT44(iVar97,in_stack_ffffffffffffe2a0));
  in0_00[0] = &local_1cf8;
  in0_00[1] = local_1c78;
  in1_00[1] = (longlong)&local_1bf8;
  in1_00[0] = (longlong)&local_1be8;
  addsub_sse4_1(in0_00,in1_00,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                in_stack_ffffffffffffe298,(__m128i *)CONCAT44(iVar97,in_stack_ffffffffffffe2a0));
  in0_01[0] = &local_1ce8;
  in0_01[1] = local_1c68;
  in1_01[1] = (longlong)&local_1bf8;
  in1_01[0] = (longlong)&local_1be8;
  addsub_sse4_1(in0_01,in1_01,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                in_stack_ffffffffffffe298,(__m128i *)CONCAT44(iVar97,in_stack_ffffffffffffe2a0));
  in0_02[0] = &local_1cd8;
  in0_02[1] = local_1c58;
  in1_02[1] = (longlong)&local_1bf8;
  in1_02[0] = (longlong)&local_1be8;
  addsub_sse4_1(in0_02,in1_02,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                in_stack_ffffffffffffe298,(__m128i *)CONCAT44(iVar97,in_stack_ffffffffffffe2a0));
  in0_03[0] = local_1cc8;
  in0_03[1] = local_1c48;
  in1_03[1] = (longlong)&local_1bf8;
  in1_03[0] = (longlong)&local_1be8;
  addsub_sse4_1(in0_03,in1_03,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                in_stack_ffffffffffffe298,(__m128i *)CONCAT44(iVar97,in_stack_ffffffffffffe2a0));
  in0_04[0] = &local_1cb8;
  in0_04[1] = local_1c38;
  in1_04[1] = (longlong)&local_1bf8;
  in1_04[0] = (longlong)&local_1be8;
  addsub_sse4_1(in0_04,in1_04,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                in_stack_ffffffffffffe298,(__m128i *)CONCAT44(iVar97,in_stack_ffffffffffffe2a0));
  in0_05[0] = local_1ca8;
  in0_05[1] = local_1c28;
  in1_05[1] = (longlong)&local_1bf8;
  in1_05[0] = (longlong)&local_1be8;
  addsub_sse4_1(in0_05,in1_05,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                in_stack_ffffffffffffe298,(__m128i *)CONCAT44(iVar97,in_stack_ffffffffffffe2a0));
  in0_06[0] = &local_1c98;
  in0_06[1] = local_1c18;
  in1_06[1] = (longlong)&local_1bf8;
  in1_06[0] = (longlong)&local_1be8;
  addsub_sse4_1(in0_06,in1_06,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                in_stack_ffffffffffffe298,(__m128i *)CONCAT44(iVar97,in_stack_ffffffffffffe2a0));
  local_5f8 = local_1c88._0_8_;
  uStack_5f0 = local_1c88._8_8_;
  local_608 = local_1b38;
  uStack_600 = uStack_1b30;
  auVar44._8_8_ = uStack_1b30;
  auVar44._0_8_ = local_1b38;
  auVar92 = pmulld(local_1c88,auVar44);
  local_618 = local_1c78._0_8_;
  uStack_610 = local_1c78._8_8_;
  local_628 = local_1b38;
  uStack_620 = uStack_1b30;
  auVar43._8_8_ = uStack_1b30;
  auVar43._0_8_ = local_1b38;
  auVar93 = pmulld(local_1c78,auVar43);
  local_638 = local_1c88._0_8_;
  uStack_630 = local_1c88._8_8_;
  local_648 = local_1b28;
  uStack_640 = uStack_1b20;
  auVar42._8_8_ = uStack_1b20;
  auVar42._0_8_ = local_1b28;
  auVar94 = pmulld(local_1c88,auVar42);
  local_1c88._0_8_ = auVar94._0_8_;
  local_1c88._8_8_ = auVar94._8_8_;
  local_1d18._0_8_ = auVar93._0_8_;
  local_1d18._8_8_ = auVar93._8_8_;
  local_1088 = local_1c88._0_8_;
  uVar75 = local_1088;
  uStack_1080 = local_1c88._8_8_;
  uVar76 = uStack_1080;
  local_1098 = local_1d18._0_8_;
  uVar73 = local_1098;
  uStack_1090 = local_1d18._8_8_;
  uVar74 = uStack_1090;
  local_1088._0_4_ = auVar94._0_4_;
  local_1088._4_4_ = auVar94._4_4_;
  uStack_1080._0_4_ = auVar94._8_4_;
  uStack_1080._4_4_ = auVar94._12_4_;
  local_1098._0_4_ = auVar93._0_4_;
  local_1098._4_4_ = auVar93._4_4_;
  uStack_1090._0_4_ = auVar93._8_4_;
  uStack_1090._4_4_ = auVar93._12_4_;
  local_1c88._4_4_ = local_1088._4_4_ + local_1098._4_4_;
  local_1c88._0_4_ = (int)local_1088 + (int)local_1098;
  local_1c88._8_4_ = (int)uStack_1080 + (int)uStack_1090;
  local_1c88._12_4_ = uStack_1080._4_4_ + uStack_1090._4_4_;
  local_10a8 = local_1c88._0_8_;
  uStack_10a0 = local_1c88._8_8_;
  local_10b8 = local_1bc8;
  iStack_10b4 = iStack_1bc4;
  iStack_10b0 = iStack_1bc0;
  iStack_10ac = iStack_1bbc;
  local_1c88._0_4_ = (int)local_1088 + (int)local_1098 + local_1bc8;
  local_1c88._4_4_ = local_1088._4_4_ + local_1098._4_4_ + iStack_1bc4;
  iVar95 = (int)uStack_1080 + (int)uStack_1090 + iStack_1bc0;
  iVar96 = uStack_1080._4_4_ + uStack_1090._4_4_ + iStack_1bbc;
  local_1c88._8_4_ = iVar95;
  local_1c88._12_4_ = iVar96;
  local_1708 = local_1c88._0_8_;
  uStack_1700 = local_1c88._8_8_;
  local_170c = local_1a04;
  auVar93 = ZEXT416(local_1a04);
  local_1c88._4_4_ = (int)local_1c88._4_4_ >> auVar93;
  local_1c88._0_4_ = (int)local_1c88._0_4_ >> auVar93;
  local_1c88._8_4_ = iVar95 >> auVar93;
  local_1c88._12_4_ = iVar96 >> auVar93;
  local_658 = local_1c78._0_8_;
  uStack_650 = local_1c78._8_8_;
  local_668 = local_1b28;
  uStack_660 = uStack_1b20;
  auVar41._8_8_ = uStack_1b20;
  auVar41._0_8_ = local_1b28;
  auVar93 = pmulld(local_1c78,auVar41);
  local_1d28._0_8_ = auVar92._0_8_;
  local_1d28._8_8_ = auVar92._8_8_;
  local_1d18._0_8_ = auVar93._0_8_;
  local_1d18._8_8_ = auVar93._8_8_;
  local_c08 = local_1d28._0_8_;
  uVar90 = local_c08;
  uStack_c00 = local_1d28._8_8_;
  uVar91 = uStack_c00;
  local_c18 = local_1d18._0_8_;
  uVar88 = local_c18;
  uStack_c10 = local_1d18._8_8_;
  uVar89 = uStack_c10;
  local_c08._0_4_ = auVar92._0_4_;
  local_c08._4_4_ = auVar92._4_4_;
  uStack_c00._0_4_ = auVar92._8_4_;
  uStack_c00._4_4_ = auVar92._12_4_;
  local_c18._0_4_ = auVar93._0_4_;
  local_c18._4_4_ = auVar93._4_4_;
  uStack_c10._0_4_ = auVar93._8_4_;
  uStack_c10._4_4_ = auVar93._12_4_;
  local_1c78._4_4_ = local_c08._4_4_ - local_c18._4_4_;
  local_1c78._0_4_ = (int)local_c08 - (int)local_c18;
  local_1c78._8_4_ = (int)uStack_c00 - (int)uStack_c10;
  local_1c78._12_4_ = uStack_c00._4_4_ - uStack_c10._4_4_;
  local_10c8 = local_1c78._0_8_;
  uStack_10c0 = local_1c78._8_8_;
  local_10d8 = local_1bc8;
  iStack_10d4 = iStack_1bc4;
  iStack_10d0 = iStack_1bc0;
  iStack_10cc = iStack_1bbc;
  local_1c78._0_4_ = ((int)local_c08 - (int)local_c18) + local_1bc8;
  local_1c78._4_4_ = (local_c08._4_4_ - local_c18._4_4_) + iStack_1bc4;
  iVar95 = ((int)uStack_c00 - (int)uStack_c10) + iStack_1bc0;
  iVar96 = (uStack_c00._4_4_ - uStack_c10._4_4_) + iStack_1bbc;
  local_1c78._8_4_ = iVar95;
  local_1c78._12_4_ = iVar96;
  local_1728 = local_1c78._0_8_;
  uStack_1720 = local_1c78._8_8_;
  local_172c = local_1a04;
  auVar92 = ZEXT416(local_1a04);
  local_1c78._4_4_ = (int)local_1c78._4_4_ >> auVar92;
  local_1c78._0_4_ = (int)local_1c78._0_4_ >> auVar92;
  local_1c78._8_4_ = iVar95 >> auVar92;
  local_1c78._12_4_ = iVar96 >> auVar92;
  local_678 = local_1c58._0_8_;
  uStack_670 = local_1c58._8_8_;
  local_688 = local_1b58;
  uStack_680 = uStack_1b50;
  auVar40._8_8_ = uStack_1b50;
  auVar40._0_8_ = local_1b58;
  auVar92 = pmulld(local_1c58,auVar40);
  local_698 = local_1c68._0_8_;
  uStack_690 = local_1c68._8_8_;
  local_6a8 = local_1b58;
  uStack_6a0 = uStack_1b50;
  auVar39._8_8_ = uStack_1b50;
  auVar39._0_8_ = local_1b58;
  auVar93 = pmulld(local_1c68,auVar39);
  local_6b8 = local_1c68._0_8_;
  uStack_6b0 = local_1c68._8_8_;
  local_6c8 = local_1b48;
  uStack_6c0 = uStack_1b40;
  auVar38._8_8_ = uStack_1b40;
  auVar38._0_8_ = local_1b48;
  auVar94 = pmulld(local_1c68,auVar38);
  local_1c68._0_8_ = auVar94._0_8_;
  local_1c68._8_8_ = auVar94._8_8_;
  local_1d18._0_8_ = auVar92._0_8_;
  local_1d18._8_8_ = auVar92._8_8_;
  local_10e8 = local_1c68._0_8_;
  uVar71 = local_10e8;
  uStack_10e0 = local_1c68._8_8_;
  uVar72 = uStack_10e0;
  local_10f8 = local_1d18._0_8_;
  uVar69 = local_10f8;
  uStack_10f0 = local_1d18._8_8_;
  uVar70 = uStack_10f0;
  local_10e8._0_4_ = auVar94._0_4_;
  local_10e8._4_4_ = auVar94._4_4_;
  uStack_10e0._0_4_ = auVar94._8_4_;
  uStack_10e0._4_4_ = auVar94._12_4_;
  local_10f8._0_4_ = auVar92._0_4_;
  local_10f8._4_4_ = auVar92._4_4_;
  uStack_10f0._0_4_ = auVar92._8_4_;
  uStack_10f0._4_4_ = auVar92._12_4_;
  local_1c68._4_4_ = local_10e8._4_4_ + local_10f8._4_4_;
  local_1c68._0_4_ = (int)local_10e8 + (int)local_10f8;
  local_1c68._8_4_ = (int)uStack_10e0 + (int)uStack_10f0;
  local_1c68._12_4_ = uStack_10e0._4_4_ + uStack_10f0._4_4_;
  local_1108 = local_1c68._0_8_;
  uStack_1100 = local_1c68._8_8_;
  local_1118 = local_1bc8;
  iStack_1114 = iStack_1bc4;
  iStack_1110 = iStack_1bc0;
  iStack_110c = iStack_1bbc;
  local_1c68._0_4_ = (int)local_10e8 + (int)local_10f8 + local_1bc8;
  local_1c68._4_4_ = local_10e8._4_4_ + local_10f8._4_4_ + iStack_1bc4;
  iVar95 = (int)uStack_10e0 + (int)uStack_10f0 + iStack_1bc0;
  iVar96 = uStack_10e0._4_4_ + uStack_10f0._4_4_ + iStack_1bbc;
  local_1c68._8_4_ = iVar95;
  local_1c68._12_4_ = iVar96;
  local_1748 = local_1c68._0_8_;
  uStack_1740 = local_1c68._8_8_;
  local_174c = local_1a04;
  auVar92 = ZEXT416(local_1a04);
  local_1c68._4_4_ = (int)local_1c68._4_4_ >> auVar92;
  local_1c68._0_4_ = (int)local_1c68._0_4_ >> auVar92;
  local_1c68._8_4_ = iVar95 >> auVar92;
  local_1c68._12_4_ = iVar96 >> auVar92;
  local_6d8 = local_1c58._0_8_;
  uStack_6d0 = local_1c58._8_8_;
  local_6e8 = local_1b48;
  uStack_6e0 = uStack_1b40;
  auVar37._8_8_ = uStack_1b40;
  auVar37._0_8_ = local_1b48;
  auVar92 = pmulld(local_1c58,auVar37);
  local_1d28._0_8_ = auVar93._0_8_;
  local_1d28._8_8_ = auVar93._8_8_;
  local_1d18._0_8_ = auVar92._0_8_;
  local_1d18._8_8_ = auVar92._8_8_;
  local_c28 = local_1d28._0_8_;
  uVar86 = local_c28;
  uStack_c20 = local_1d28._8_8_;
  uVar87 = uStack_c20;
  local_c38 = local_1d18._0_8_;
  uVar84 = local_c38;
  uStack_c30 = local_1d18._8_8_;
  uVar85 = uStack_c30;
  local_c28._0_4_ = auVar93._0_4_;
  local_c28._4_4_ = auVar93._4_4_;
  uStack_c20._0_4_ = auVar93._8_4_;
  uStack_c20._4_4_ = auVar93._12_4_;
  local_c38._0_4_ = auVar92._0_4_;
  local_c38._4_4_ = auVar92._4_4_;
  uStack_c30._0_4_ = auVar92._8_4_;
  uStack_c30._4_4_ = auVar92._12_4_;
  local_1c58._4_4_ = local_c28._4_4_ - local_c38._4_4_;
  local_1c58._0_4_ = (int)local_c28 - (int)local_c38;
  local_1c58._8_4_ = (int)uStack_c20 - (int)uStack_c30;
  local_1c58._12_4_ = uStack_c20._4_4_ - uStack_c30._4_4_;
  local_1128 = local_1c58._0_8_;
  uStack_1120 = local_1c58._8_8_;
  local_1138 = local_1bc8;
  iStack_1134 = iStack_1bc4;
  iStack_1130 = iStack_1bc0;
  iStack_112c = iStack_1bbc;
  local_1c58._0_4_ = ((int)local_c28 - (int)local_c38) + local_1bc8;
  local_1c58._4_4_ = (local_c28._4_4_ - local_c38._4_4_) + iStack_1bc4;
  iVar95 = ((int)uStack_c20 - (int)uStack_c30) + iStack_1bc0;
  iVar96 = (uStack_c20._4_4_ - uStack_c30._4_4_) + iStack_1bbc;
  local_1c58._8_4_ = iVar95;
  local_1c58._12_4_ = iVar96;
  local_1768 = local_1c58._0_8_;
  uStack_1760 = local_1c58._8_8_;
  local_176c = local_1a04;
  auVar92 = ZEXT416(local_1a04);
  local_1c58._4_4_ = (int)local_1c58._4_4_ >> auVar92;
  local_1c58._0_4_ = (int)local_1c58._0_4_ >> auVar92;
  local_1c58._8_4_ = iVar95 >> auVar92;
  local_1c58._12_4_ = iVar96 >> auVar92;
  local_6f8 = local_1c38._0_8_;
  uStack_6f0 = local_1c38._8_8_;
  local_708 = local_1b28;
  uStack_700 = uStack_1b20;
  auVar36._8_8_ = uStack_1b20;
  auVar36._0_8_ = local_1b28;
  auVar92 = pmulld(local_1c38,auVar36);
  local_718 = local_1c48._0_8_;
  uStack_710 = local_1c48._8_8_;
  local_728 = local_1b28;
  uStack_720 = uStack_1b20;
  auVar35._8_8_ = uStack_1b20;
  auVar35._0_8_ = local_1b28;
  auVar93 = pmulld(local_1c48,auVar35);
  local_738 = local_1c48._0_8_;
  uStack_730 = local_1c48._8_8_;
  local_748 = local_1b68;
  uStack_740 = uStack_1b60;
  auVar34._8_8_ = uStack_1b60;
  auVar34._0_8_ = local_1b68;
  auVar94 = pmulld(local_1c48,auVar34);
  local_1c48._0_8_ = auVar94._0_8_;
  local_1c48._8_8_ = auVar94._8_8_;
  local_1d18._0_8_ = auVar92._0_8_;
  local_1d18._8_8_ = auVar92._8_8_;
  local_1148 = local_1c48._0_8_;
  uVar67 = local_1148;
  uStack_1140 = local_1c48._8_8_;
  uVar68 = uStack_1140;
  local_1158 = local_1d18._0_8_;
  uVar65 = local_1158;
  uStack_1150 = local_1d18._8_8_;
  uVar66 = uStack_1150;
  local_1148._0_4_ = auVar94._0_4_;
  local_1148._4_4_ = auVar94._4_4_;
  uStack_1140._0_4_ = auVar94._8_4_;
  uStack_1140._4_4_ = auVar94._12_4_;
  local_1158._0_4_ = auVar92._0_4_;
  local_1158._4_4_ = auVar92._4_4_;
  uStack_1150._0_4_ = auVar92._8_4_;
  uStack_1150._4_4_ = auVar92._12_4_;
  local_1c48._4_4_ = local_1148._4_4_ + local_1158._4_4_;
  local_1c48._0_4_ = (int)local_1148 + (int)local_1158;
  local_1c48._8_4_ = (int)uStack_1140 + (int)uStack_1150;
  local_1c48._12_4_ = uStack_1140._4_4_ + uStack_1150._4_4_;
  local_1168 = local_1c48._0_8_;
  uStack_1160 = local_1c48._8_8_;
  local_1178 = local_1bc8;
  iStack_1174 = iStack_1bc4;
  iStack_1170 = iStack_1bc0;
  iStack_116c = iStack_1bbc;
  local_1c48._0_4_ = (int)local_1148 + (int)local_1158 + local_1bc8;
  local_1c48._4_4_ = local_1148._4_4_ + local_1158._4_4_ + iStack_1bc4;
  iVar95 = (int)uStack_1140 + (int)uStack_1150 + iStack_1bc0;
  iVar96 = uStack_1140._4_4_ + uStack_1150._4_4_ + iStack_1bbc;
  local_1c48._8_4_ = iVar95;
  local_1c48._12_4_ = iVar96;
  local_1788 = local_1c48._0_8_;
  uStack_1780 = local_1c48._8_8_;
  local_178c = local_1a04;
  auVar92 = ZEXT416(local_1a04);
  local_1c48._4_4_ = (int)local_1c48._4_4_ >> auVar92;
  local_1c48._0_4_ = (int)local_1c48._0_4_ >> auVar92;
  local_1c48._8_4_ = iVar95 >> auVar92;
  local_1c48._12_4_ = iVar96 >> auVar92;
  local_758 = local_1c38._0_8_;
  uStack_750 = local_1c38._8_8_;
  local_768 = local_1b68;
  uStack_760 = uStack_1b60;
  auVar33._8_8_ = uStack_1b60;
  auVar33._0_8_ = local_1b68;
  auVar92 = pmulld(local_1c38,auVar33);
  local_1d28._0_8_ = auVar93._0_8_;
  local_1d28._8_8_ = auVar93._8_8_;
  local_1d18._0_8_ = auVar92._0_8_;
  local_1d18._8_8_ = auVar92._8_8_;
  local_c48 = local_1d28._0_8_;
  uVar82 = local_c48;
  uStack_c40 = local_1d28._8_8_;
  uVar83 = uStack_c40;
  local_c58 = local_1d18._0_8_;
  uVar80 = local_c58;
  uStack_c50 = local_1d18._8_8_;
  uVar81 = uStack_c50;
  local_c48._0_4_ = auVar93._0_4_;
  local_c48._4_4_ = auVar93._4_4_;
  uStack_c40._0_4_ = auVar93._8_4_;
  uStack_c40._4_4_ = auVar93._12_4_;
  local_c58._0_4_ = auVar92._0_4_;
  local_c58._4_4_ = auVar92._4_4_;
  uStack_c50._0_4_ = auVar92._8_4_;
  uStack_c50._4_4_ = auVar92._12_4_;
  local_1c38._4_4_ = local_c48._4_4_ - local_c58._4_4_;
  local_1c38._0_4_ = (int)local_c48 - (int)local_c58;
  local_1c38._8_4_ = (int)uStack_c40 - (int)uStack_c50;
  local_1c38._12_4_ = uStack_c40._4_4_ - uStack_c50._4_4_;
  local_1188 = local_1c38._0_8_;
  uStack_1180 = local_1c38._8_8_;
  local_1198 = local_1bc8;
  iStack_1194 = iStack_1bc4;
  iStack_1190 = iStack_1bc0;
  iStack_118c = iStack_1bbc;
  local_1c38._0_4_ = ((int)local_c48 - (int)local_c58) + local_1bc8;
  local_1c38._4_4_ = (local_c48._4_4_ - local_c58._4_4_) + iStack_1bc4;
  iVar95 = ((int)uStack_c40 - (int)uStack_c50) + iStack_1bc0;
  iVar96 = (uStack_c40._4_4_ - uStack_c50._4_4_) + iStack_1bbc;
  local_1c38._8_4_ = iVar95;
  local_1c38._12_4_ = iVar96;
  local_17a8 = local_1c38._0_8_;
  uStack_17a0 = local_1c38._8_8_;
  local_17ac = local_1a04;
  auVar92 = ZEXT416(local_1a04);
  local_1c38._4_4_ = (int)local_1c38._4_4_ >> auVar92;
  local_1c38._0_4_ = (int)local_1c38._0_4_ >> auVar92;
  local_1c38._8_4_ = iVar95 >> auVar92;
  local_1c38._12_4_ = iVar96 >> auVar92;
  local_778 = local_1c18._0_8_;
  uStack_770 = local_1c18._8_8_;
  local_788 = local_1b48;
  uStack_780 = uStack_1b40;
  auVar32._8_8_ = uStack_1b40;
  auVar32._0_8_ = local_1b48;
  auVar92 = pmulld(local_1c18,auVar32);
  local_798 = local_1c28._0_8_;
  uStack_790 = local_1c28._8_8_;
  local_7a8 = local_1b48;
  uStack_7a0 = uStack_1b40;
  auVar31._8_8_ = uStack_1b40;
  auVar31._0_8_ = local_1b48;
  local_1d28 = pmulld(local_1c28,auVar31);
  local_7b8 = local_1c28._0_8_;
  uStack_7b0 = local_1c28._8_8_;
  local_7c8 = local_1b78;
  uStack_7c0 = uStack_1b70;
  auVar30._8_8_ = uStack_1b70;
  auVar30._0_8_ = local_1b78;
  auVar93 = pmulld(local_1c28,auVar30);
  local_1c28._0_8_ = auVar93._0_8_;
  local_1c28._8_8_ = auVar93._8_8_;
  local_1d18._0_8_ = auVar92._0_8_;
  local_1d18._8_8_ = auVar92._8_8_;
  local_11a8 = local_1c28._0_8_;
  uVar63 = local_11a8;
  uStack_11a0 = local_1c28._8_8_;
  uVar64 = uStack_11a0;
  local_11b8 = local_1d18._0_8_;
  uVar61 = local_11b8;
  uStack_11b0 = local_1d18._8_8_;
  uVar62 = uStack_11b0;
  local_11a8._0_4_ = auVar93._0_4_;
  local_11a8._4_4_ = auVar93._4_4_;
  uStack_11a0._0_4_ = auVar93._8_4_;
  uStack_11a0._4_4_ = auVar93._12_4_;
  local_11b8._0_4_ = auVar92._0_4_;
  local_11b8._4_4_ = auVar92._4_4_;
  uStack_11b0._0_4_ = auVar92._8_4_;
  uStack_11b0._4_4_ = auVar92._12_4_;
  local_1c28._4_4_ = local_11a8._4_4_ + local_11b8._4_4_;
  local_1c28._0_4_ = (int)local_11a8 + (int)local_11b8;
  local_1c28._8_4_ = (int)uStack_11a0 + (int)uStack_11b0;
  local_1c28._12_4_ = uStack_11a0._4_4_ + uStack_11b0._4_4_;
  local_11c8 = local_1c28._0_8_;
  uStack_11c0 = local_1c28._8_8_;
  local_11d8 = local_1bc8;
  iStack_11d4 = iStack_1bc4;
  iStack_11d0 = iStack_1bc0;
  iStack_11cc = iStack_1bbc;
  local_1c28._0_4_ = (int)local_11a8 + (int)local_11b8 + local_1bc8;
  local_1c28._4_4_ = local_11a8._4_4_ + local_11b8._4_4_ + iStack_1bc4;
  iVar95 = (int)uStack_11a0 + (int)uStack_11b0 + iStack_1bc0;
  iVar96 = uStack_11a0._4_4_ + uStack_11b0._4_4_ + iStack_1bbc;
  local_1c28._8_4_ = iVar95;
  local_1c28._12_4_ = iVar96;
  local_17c8 = local_1c28._0_8_;
  uStack_17c0 = local_1c28._8_8_;
  local_17cc = local_1a04;
  auVar92 = ZEXT416(local_1a04);
  local_1c28._4_4_ = (int)local_1c28._4_4_ >> auVar92;
  local_1c28._0_4_ = (int)local_1c28._0_4_ >> auVar92;
  local_1c28._8_4_ = iVar95 >> auVar92;
  local_1c28._12_4_ = iVar96 >> auVar92;
  local_7d8 = local_1c18._0_8_;
  uStack_7d0 = local_1c18._8_8_;
  local_7e8 = local_1b78;
  uStack_7e0 = uStack_1b70;
  auVar29._8_8_ = uStack_1b70;
  auVar29._0_8_ = local_1b78;
  local_1d18 = pmulld(local_1c18,auVar29);
  local_c68 = local_1d28._0_8_;
  uVar78 = local_c68;
  uStack_c60 = local_1d28._8_8_;
  uVar79 = uStack_c60;
  local_c78 = local_1d18._0_8_;
  uVar98 = local_c78;
  uStack_c70 = local_1d18._8_8_;
  uVar77 = uStack_c70;
  local_c68._0_4_ = local_1d28._0_4_;
  local_c68._4_4_ = local_1d28._4_4_;
  uStack_c60._0_4_ = local_1d28._8_4_;
  uStack_c60._4_4_ = local_1d28._12_4_;
  local_c78._0_4_ = local_1d18._0_4_;
  local_c78._4_4_ = local_1d18._4_4_;
  uStack_c70._0_4_ = local_1d18._8_4_;
  uStack_c70._4_4_ = local_1d18._12_4_;
  local_1c18._4_4_ = local_c68._4_4_ - local_c78._4_4_;
  local_1c18._0_4_ = (int)local_c68 - (int)local_c78;
  local_1c18._8_4_ = (int)uStack_c60 - (int)uStack_c70;
  local_1c18._12_4_ = uStack_c60._4_4_ - uStack_c70._4_4_;
  local_11e8 = local_1c18._0_8_;
  uStack_11e0 = local_1c18._8_8_;
  local_11f8 = local_1bc8;
  iStack_11f4 = iStack_1bc4;
  iStack_11f0 = iStack_1bc0;
  iStack_11ec = iStack_1bbc;
  local_1c18._0_4_ = ((int)local_c68 - (int)local_c78) + local_1bc8;
  local_1c18._4_4_ = (local_c68._4_4_ - local_c78._4_4_) + iStack_1bc4;
  iVar95 = ((int)uStack_c60 - (int)uStack_c70) + iStack_1bc0;
  iVar96 = (uStack_c60._4_4_ - uStack_c70._4_4_) + iStack_1bbc;
  local_1c18._8_4_ = iVar95;
  local_1c18._12_4_ = iVar96;
  local_17e8 = local_1c18._0_8_;
  uStack_17e0 = local_1c18._8_8_;
  local_17ec = local_1a04;
  auVar92 = ZEXT416(local_1a04);
  local_1c18._4_4_ = (int)local_1c18._4_4_ >> auVar92;
  local_1c18._0_4_ = (int)local_1c18._0_4_ >> auVar92;
  local_1c18._8_4_ = iVar95 >> auVar92;
  local_1c18._12_4_ = iVar96 >> auVar92;
  in0_07[1] = local_1cc8;
  in0_07[0] = (longlong)&local_1d08;
  in1_07[1] = (longlong)&local_1bf8;
  in1_07[0] = (longlong)&local_1be8;
  local_11b8 = uVar61;
  uStack_11b0 = uVar62;
  local_11a8 = uVar63;
  uStack_11a0 = uVar64;
  local_1158 = uVar65;
  uStack_1150 = uVar66;
  local_1148 = uVar67;
  uStack_1140 = uVar68;
  local_10f8 = uVar69;
  uStack_10f0 = uVar70;
  local_10e8 = uVar71;
  uStack_10e0 = uVar72;
  local_1098 = uVar73;
  uStack_1090 = uVar74;
  local_1088 = uVar75;
  uStack_1080 = uVar76;
  local_c78 = uVar98;
  uStack_c70 = uVar77;
  local_c68 = uVar78;
  uStack_c60 = uVar79;
  local_c58 = uVar80;
  uStack_c50 = uVar81;
  local_c48 = uVar82;
  uStack_c40 = uVar83;
  local_c38 = uVar84;
  uStack_c30 = uVar85;
  local_c28 = uVar86;
  uStack_c20 = uVar87;
  local_c18 = uVar88;
  uStack_c10 = uVar89;
  local_c08 = uVar90;
  uStack_c00 = uVar91;
  addsub_sse4_1(in0_07,in1_07,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                in_stack_ffffffffffffe298,(__m128i *)CONCAT44(iVar97,in_stack_ffffffffffffe2a0));
  in0_08[0] = &local_1cf8;
  in0_08[1] = &local_1cb8;
  in1_08[1] = (longlong)&local_1bf8;
  in1_08[0] = (longlong)&local_1be8;
  addsub_sse4_1(in0_08,in1_08,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                in_stack_ffffffffffffe298,(__m128i *)CONCAT44(iVar97,in_stack_ffffffffffffe2a0));
  in0_09[0] = &local_1ce8;
  in0_09[1] = local_1ca8;
  in1_09[1] = (longlong)&local_1bf8;
  in1_09[0] = (longlong)&local_1be8;
  addsub_sse4_1(in0_09,in1_09,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                in_stack_ffffffffffffe298,(__m128i *)CONCAT44(iVar97,in_stack_ffffffffffffe2a0));
  in0_10[0] = &local_1cd8;
  in0_10[1] = &local_1c98;
  in1_10[1] = (longlong)&local_1bf8;
  in1_10[0] = (longlong)&local_1be8;
  addsub_sse4_1(in0_10,in1_10,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                in_stack_ffffffffffffe298,(__m128i *)CONCAT44(iVar97,in_stack_ffffffffffffe2a0));
  in0_11[0] = local_1c88;
  in0_11[1] = local_1c48;
  in1_11[1] = (longlong)&local_1bf8;
  in1_11[0] = (longlong)&local_1be8;
  addsub_sse4_1(in0_11,in1_11,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                in_stack_ffffffffffffe298,(__m128i *)CONCAT44(iVar97,in_stack_ffffffffffffe2a0));
  in0_12[0] = local_1c78;
  in0_12[1] = local_1c38;
  in1_12[1] = (longlong)&local_1bf8;
  in1_12[0] = (longlong)&local_1be8;
  addsub_sse4_1(in0_12,in1_12,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                in_stack_ffffffffffffe298,(__m128i *)CONCAT44(iVar97,in_stack_ffffffffffffe2a0));
  in0_13[0] = local_1c68;
  in0_13[1] = local_1c28;
  in1_13[1] = (longlong)&local_1bf8;
  in1_13[0] = (longlong)&local_1be8;
  addsub_sse4_1(in0_13,in1_13,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                in_stack_ffffffffffffe298,(__m128i *)CONCAT44(iVar97,in_stack_ffffffffffffe2a0));
  in0_14[0] = local_1c58;
  in0_14[1] = local_1c18;
  in1_14[1] = (longlong)&local_1bf8;
  in1_14[0] = (longlong)&local_1be8;
  addsub_sse4_1(in0_14,in1_14,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                in_stack_ffffffffffffe298,(__m128i *)CONCAT44(iVar97,in_stack_ffffffffffffe2a0));
  local_7f8 = CONCAT44(iStack_1cb4,local_1cb8);
  uStack_7f0 = CONCAT44(iStack_1cac,iStack_1cb0);
  local_808 = local_1b88;
  uStack_800 = uStack_1b80;
  auVar28._8_8_ = uStack_7f0;
  auVar28._0_8_ = local_7f8;
  auVar27._8_8_ = uStack_1b80;
  auVar27._0_8_ = local_1b88;
  auVar92 = pmulld(auVar28,auVar27);
  local_818 = local_1cc8._0_8_;
  uStack_810 = local_1cc8._8_8_;
  local_828 = local_1b88;
  uStack_820 = uStack_1b80;
  auVar26._8_8_ = uStack_1b80;
  auVar26._0_8_ = local_1b88;
  auVar93 = pmulld(local_1cc8,auVar26);
  local_838 = local_1cc8._0_8_;
  uStack_830 = local_1cc8._8_8_;
  local_848 = local_1b98;
  uStack_840 = uStack_1b90;
  auVar25._8_8_ = uStack_1b90;
  auVar25._0_8_ = local_1b98;
  auVar94 = pmulld(local_1cc8,auVar25);
  local_1cc8._0_8_ = auVar94._0_8_;
  local_1cc8._8_8_ = auVar94._8_8_;
  local_1d18._0_8_ = auVar92._0_8_;
  local_1d18._8_8_ = auVar92._8_8_;
  local_1208 = local_1cc8._0_8_;
  uVar75 = local_1208;
  uStack_1200 = local_1cc8._8_8_;
  uVar76 = uStack_1200;
  local_1218 = local_1d18._0_8_;
  uVar73 = local_1218;
  uStack_1210 = local_1d18._8_8_;
  uVar74 = uStack_1210;
  local_1208._0_4_ = auVar94._0_4_;
  local_1208._4_4_ = auVar94._4_4_;
  uStack_1200._0_4_ = auVar94._8_4_;
  uStack_1200._4_4_ = auVar94._12_4_;
  local_1218._0_4_ = auVar92._0_4_;
  local_1218._4_4_ = auVar92._4_4_;
  uStack_1210._0_4_ = auVar92._8_4_;
  uStack_1210._4_4_ = auVar92._12_4_;
  local_1cc8._4_4_ = local_1208._4_4_ + local_1218._4_4_;
  local_1cc8._0_4_ = (int)local_1208 + (int)local_1218;
  local_1cc8._8_4_ = (int)uStack_1200 + (int)uStack_1210;
  local_1cc8._12_4_ = uStack_1200._4_4_ + uStack_1210._4_4_;
  local_1228 = local_1cc8._0_8_;
  uStack_1220 = local_1cc8._8_8_;
  local_1238 = local_1bc8;
  iStack_1234 = iStack_1bc4;
  iStack_1230 = iStack_1bc0;
  iStack_122c = iStack_1bbc;
  local_1cc8._0_4_ = (int)local_1208 + (int)local_1218 + local_1bc8;
  local_1cc8._4_4_ = local_1208._4_4_ + local_1218._4_4_ + iStack_1bc4;
  iVar95 = (int)uStack_1200 + (int)uStack_1210 + iStack_1bc0;
  iVar96 = uStack_1200._4_4_ + uStack_1210._4_4_ + iStack_1bbc;
  local_1cc8._8_4_ = iVar95;
  local_1cc8._12_4_ = iVar96;
  local_1808 = local_1cc8._0_8_;
  uStack_1800 = local_1cc8._8_8_;
  local_180c = local_1a04;
  auVar92 = ZEXT416(local_1a04);
  local_1cc8._4_4_ = (int)local_1cc8._4_4_ >> auVar92;
  local_1cc8._0_4_ = (int)local_1cc8._0_4_ >> auVar92;
  local_1cc8._8_4_ = iVar95 >> auVar92;
  local_1cc8._12_4_ = iVar96 >> auVar92;
  local_858 = CONCAT44(iStack_1cb4,local_1cb8);
  uStack_850 = CONCAT44(iStack_1cac,iStack_1cb0);
  local_868 = local_1b98;
  uStack_860 = uStack_1b90;
  auVar24._8_8_ = uStack_850;
  auVar24._0_8_ = local_858;
  auVar23._8_8_ = uStack_1b90;
  auVar23._0_8_ = local_1b98;
  auVar92 = pmulld(auVar24,auVar23);
  local_1d28._0_8_ = auVar93._0_8_;
  local_1d28._8_8_ = auVar93._8_8_;
  local_1d18._0_8_ = auVar92._0_8_;
  local_1d18._8_8_ = auVar92._8_8_;
  local_c88 = local_1d28._0_8_;
  uVar90 = local_c88;
  uStack_c80 = local_1d28._8_8_;
  uVar91 = uStack_c80;
  local_c98 = local_1d18._0_8_;
  uVar88 = local_c98;
  uStack_c90 = local_1d18._8_8_;
  uVar89 = uStack_c90;
  local_c88._0_4_ = auVar93._0_4_;
  local_c88._4_4_ = auVar93._4_4_;
  uStack_c80._0_4_ = auVar93._8_4_;
  uStack_c80._4_4_ = auVar93._12_4_;
  local_c98._0_4_ = auVar92._0_4_;
  local_c98._4_4_ = auVar92._4_4_;
  uStack_c90._0_4_ = auVar92._8_4_;
  uStack_c90._4_4_ = auVar92._12_4_;
  local_1248 = CONCAT44(local_c88._4_4_ - local_c98._4_4_,(int)local_c88 - (int)local_c98);
  uStack_1240 = CONCAT44(uStack_c80._4_4_ - uStack_c90._4_4_,(int)uStack_c80 - (int)uStack_c90);
  local_1258 = local_1bc8;
  iStack_1254 = iStack_1bc4;
  iStack_1250 = iStack_1bc0;
  iStack_124c = iStack_1bbc;
  local_1cb8 = ((int)local_c88 - (int)local_c98) + local_1bc8;
  iStack_1cb4 = (local_c88._4_4_ - local_c98._4_4_) + iStack_1bc4;
  iStack_1cb0 = ((int)uStack_c80 - (int)uStack_c90) + iStack_1bc0;
  iStack_1cac = (uStack_c80._4_4_ - uStack_c90._4_4_) + iStack_1bbc;
  local_1828 = CONCAT44(iStack_1cb4,local_1cb8);
  uStack_1820 = CONCAT44(iStack_1cac,iStack_1cb0);
  local_182c = local_1a04;
  auVar92 = ZEXT416(local_1a04);
  local_1cb8 = local_1cb8 >> auVar92;
  iStack_1cb4 = iStack_1cb4 >> auVar92;
  iStack_1cb0 = iStack_1cb0 >> auVar92;
  iStack_1cac = iStack_1cac >> auVar92;
  local_878 = CONCAT44(iStack_1c94,local_1c98);
  uStack_870 = CONCAT44(iStack_1c8c,iStack_1c90);
  local_888 = local_1b98;
  uStack_880 = uStack_1b90;
  auVar22._8_8_ = uStack_870;
  auVar22._0_8_ = local_878;
  auVar21._8_8_ = uStack_1b90;
  auVar21._0_8_ = local_1b98;
  auVar92 = pmulld(auVar22,auVar21);
  local_898 = local_1ca8._0_8_;
  uStack_890 = local_1ca8._8_8_;
  local_8a8 = local_1b98;
  uStack_8a0 = uStack_1b90;
  auVar20._8_8_ = uStack_1b90;
  auVar20._0_8_ = local_1b98;
  auVar93 = pmulld(local_1ca8,auVar20);
  local_8b8 = local_1ca8._0_8_;
  uStack_8b0 = local_1ca8._8_8_;
  local_8c8 = local_1ba8;
  uStack_8c0 = uStack_1ba0;
  auVar19._8_8_ = uStack_1ba0;
  auVar19._0_8_ = local_1ba8;
  auVar94 = pmulld(local_1ca8,auVar19);
  local_1ca8._0_8_ = auVar94._0_8_;
  local_1ca8._8_8_ = auVar94._8_8_;
  local_1d18._0_8_ = auVar92._0_8_;
  local_1d18._8_8_ = auVar92._8_8_;
  local_1268 = local_1ca8._0_8_;
  uVar71 = local_1268;
  uStack_1260 = local_1ca8._8_8_;
  uVar72 = uStack_1260;
  local_1278 = local_1d18._0_8_;
  uVar69 = local_1278;
  uStack_1270 = local_1d18._8_8_;
  uVar70 = uStack_1270;
  local_1268._0_4_ = auVar94._0_4_;
  local_1268._4_4_ = auVar94._4_4_;
  uStack_1260._0_4_ = auVar94._8_4_;
  uStack_1260._4_4_ = auVar94._12_4_;
  local_1278._0_4_ = auVar92._0_4_;
  local_1278._4_4_ = auVar92._4_4_;
  uStack_1270._0_4_ = auVar92._8_4_;
  uStack_1270._4_4_ = auVar92._12_4_;
  local_1ca8._4_4_ = local_1268._4_4_ + local_1278._4_4_;
  local_1ca8._0_4_ = (int)local_1268 + (int)local_1278;
  local_1ca8._8_4_ = (int)uStack_1260 + (int)uStack_1270;
  local_1ca8._12_4_ = uStack_1260._4_4_ + uStack_1270._4_4_;
  local_1288 = local_1ca8._0_8_;
  uStack_1280 = local_1ca8._8_8_;
  local_1298 = local_1bc8;
  iStack_1294 = iStack_1bc4;
  iStack_1290 = iStack_1bc0;
  iStack_128c = iStack_1bbc;
  local_1ca8._0_4_ = (int)local_1268 + (int)local_1278 + local_1bc8;
  local_1ca8._4_4_ = local_1268._4_4_ + local_1278._4_4_ + iStack_1bc4;
  iVar95 = (int)uStack_1260 + (int)uStack_1270 + iStack_1bc0;
  iVar96 = uStack_1260._4_4_ + uStack_1270._4_4_ + iStack_1bbc;
  local_1ca8._8_4_ = iVar95;
  local_1ca8._12_4_ = iVar96;
  local_1848 = local_1ca8._0_8_;
  uStack_1840 = local_1ca8._8_8_;
  local_184c = local_1a04;
  auVar92 = ZEXT416(local_1a04);
  local_1ca8._4_4_ = (int)local_1ca8._4_4_ >> auVar92;
  local_1ca8._0_4_ = (int)local_1ca8._0_4_ >> auVar92;
  local_1ca8._8_4_ = iVar95 >> auVar92;
  local_1ca8._12_4_ = iVar96 >> auVar92;
  local_8d8 = CONCAT44(iStack_1c94,local_1c98);
  uStack_8d0 = CONCAT44(iStack_1c8c,iStack_1c90);
  local_8e8 = local_1ba8;
  uStack_8e0 = uStack_1ba0;
  auVar18._8_8_ = uStack_8d0;
  auVar18._0_8_ = local_8d8;
  auVar17._8_8_ = uStack_1ba0;
  auVar17._0_8_ = local_1ba8;
  auVar92 = pmulld(auVar18,auVar17);
  local_1d28._0_8_ = auVar93._0_8_;
  local_1d28._8_8_ = auVar93._8_8_;
  local_1d18._0_8_ = auVar92._0_8_;
  local_1d18._8_8_ = auVar92._8_8_;
  local_ca8 = local_1d28._0_8_;
  uVar86 = local_ca8;
  uStack_ca0 = local_1d28._8_8_;
  uVar87 = uStack_ca0;
  local_cb8 = local_1d18._0_8_;
  uVar84 = local_cb8;
  uStack_cb0 = local_1d18._8_8_;
  uVar85 = uStack_cb0;
  local_ca8._0_4_ = auVar93._0_4_;
  local_ca8._4_4_ = auVar93._4_4_;
  uStack_ca0._0_4_ = auVar93._8_4_;
  uStack_ca0._4_4_ = auVar93._12_4_;
  local_cb8._0_4_ = auVar92._0_4_;
  local_cb8._4_4_ = auVar92._4_4_;
  uStack_cb0._0_4_ = auVar92._8_4_;
  uStack_cb0._4_4_ = auVar92._12_4_;
  local_12a8 = CONCAT44(local_ca8._4_4_ - local_cb8._4_4_,(int)local_ca8 - (int)local_cb8);
  uStack_12a0 = CONCAT44(uStack_ca0._4_4_ - uStack_cb0._4_4_,(int)uStack_ca0 - (int)uStack_cb0);
  local_12b8 = local_1bc8;
  iStack_12b4 = iStack_1bc4;
  iStack_12b0 = iStack_1bc0;
  iStack_12ac = iStack_1bbc;
  local_1c98 = ((int)local_ca8 - (int)local_cb8) + local_1bc8;
  iStack_1c94 = (local_ca8._4_4_ - local_cb8._4_4_) + iStack_1bc4;
  iStack_1c90 = ((int)uStack_ca0 - (int)uStack_cb0) + iStack_1bc0;
  iStack_1c8c = (uStack_ca0._4_4_ - uStack_cb0._4_4_) + iStack_1bbc;
  local_1868 = CONCAT44(iStack_1c94,local_1c98);
  uStack_1860 = CONCAT44(iStack_1c8c,iStack_1c90);
  local_186c = local_1a04;
  auVar92 = ZEXT416(local_1a04);
  local_1c98 = local_1c98 >> auVar92;
  iStack_1c94 = iStack_1c94 >> auVar92;
  iStack_1c90 = iStack_1c90 >> auVar92;
  iStack_1c8c = iStack_1c8c >> auVar92;
  local_8f8 = local_1c38._0_8_;
  uStack_8f0 = local_1c38._8_8_;
  local_908 = local_1b88;
  uStack_900 = uStack_1b80;
  auVar16._8_8_ = uStack_1b80;
  auVar16._0_8_ = local_1b88;
  auVar92 = pmulld(local_1c38,auVar16);
  local_918 = local_1c48._0_8_;
  uStack_910 = local_1c48._8_8_;
  local_928 = local_1b88;
  uStack_920 = uStack_1b80;
  auVar15._8_8_ = uStack_1b80;
  auVar15._0_8_ = local_1b88;
  auVar93 = pmulld(local_1c48,auVar15);
  local_938 = local_1c48._0_8_;
  uStack_930 = local_1c48._8_8_;
  local_948 = local_1b98;
  uStack_940 = uStack_1b90;
  auVar14._8_8_ = uStack_1b90;
  auVar14._0_8_ = local_1b98;
  auVar94 = pmulld(local_1c48,auVar14);
  local_1c48._0_8_ = auVar94._0_8_;
  local_1c48._8_8_ = auVar94._8_8_;
  local_1d18._0_8_ = auVar92._0_8_;
  local_1d18._8_8_ = auVar92._8_8_;
  local_12c8 = local_1c48._0_8_;
  uVar67 = local_12c8;
  uStack_12c0 = local_1c48._8_8_;
  uVar68 = uStack_12c0;
  local_12d8 = local_1d18._0_8_;
  uVar65 = local_12d8;
  uStack_12d0 = local_1d18._8_8_;
  uVar66 = uStack_12d0;
  local_12c8._0_4_ = auVar94._0_4_;
  local_12c8._4_4_ = auVar94._4_4_;
  uStack_12c0._0_4_ = auVar94._8_4_;
  uStack_12c0._4_4_ = auVar94._12_4_;
  local_12d8._0_4_ = auVar92._0_4_;
  local_12d8._4_4_ = auVar92._4_4_;
  uStack_12d0._0_4_ = auVar92._8_4_;
  uStack_12d0._4_4_ = auVar92._12_4_;
  local_1c48._4_4_ = local_12c8._4_4_ + local_12d8._4_4_;
  local_1c48._0_4_ = (int)local_12c8 + (int)local_12d8;
  local_1c48._8_4_ = (int)uStack_12c0 + (int)uStack_12d0;
  local_1c48._12_4_ = uStack_12c0._4_4_ + uStack_12d0._4_4_;
  local_12e8 = local_1c48._0_8_;
  uStack_12e0 = local_1c48._8_8_;
  local_12f8 = local_1bc8;
  iStack_12f4 = iStack_1bc4;
  iStack_12f0 = iStack_1bc0;
  iStack_12ec = iStack_1bbc;
  local_1c48._0_4_ = (int)local_12c8 + (int)local_12d8 + local_1bc8;
  local_1c48._4_4_ = local_12c8._4_4_ + local_12d8._4_4_ + iStack_1bc4;
  iVar95 = (int)uStack_12c0 + (int)uStack_12d0 + iStack_1bc0;
  iVar96 = uStack_12c0._4_4_ + uStack_12d0._4_4_ + iStack_1bbc;
  local_1c48._8_4_ = iVar95;
  local_1c48._12_4_ = iVar96;
  local_1888 = local_1c48._0_8_;
  uStack_1880 = local_1c48._8_8_;
  local_188c = local_1a04;
  auVar92 = ZEXT416(local_1a04);
  local_1c48._4_4_ = (int)local_1c48._4_4_ >> auVar92;
  local_1c48._0_4_ = (int)local_1c48._0_4_ >> auVar92;
  local_1c48._8_4_ = iVar95 >> auVar92;
  local_1c48._12_4_ = iVar96 >> auVar92;
  local_958 = local_1c38._0_8_;
  uStack_950 = local_1c38._8_8_;
  local_968 = local_1b98;
  uStack_960 = uStack_1b90;
  auVar13._8_8_ = uStack_1b90;
  auVar13._0_8_ = local_1b98;
  auVar92 = pmulld(local_1c38,auVar13);
  local_1d28._0_8_ = auVar93._0_8_;
  local_1d28._8_8_ = auVar93._8_8_;
  local_1d18._0_8_ = auVar92._0_8_;
  local_1d18._8_8_ = auVar92._8_8_;
  local_cc8 = local_1d28._0_8_;
  uVar82 = local_cc8;
  uStack_cc0 = local_1d28._8_8_;
  uVar83 = uStack_cc0;
  local_cd8 = local_1d18._0_8_;
  uVar80 = local_cd8;
  uStack_cd0 = local_1d18._8_8_;
  uVar81 = uStack_cd0;
  local_cc8._0_4_ = auVar93._0_4_;
  local_cc8._4_4_ = auVar93._4_4_;
  uStack_cc0._0_4_ = auVar93._8_4_;
  uStack_cc0._4_4_ = auVar93._12_4_;
  local_cd8._0_4_ = auVar92._0_4_;
  local_cd8._4_4_ = auVar92._4_4_;
  uStack_cd0._0_4_ = auVar92._8_4_;
  uStack_cd0._4_4_ = auVar92._12_4_;
  local_1c38._4_4_ = local_cc8._4_4_ - local_cd8._4_4_;
  local_1c38._0_4_ = (int)local_cc8 - (int)local_cd8;
  local_1c38._8_4_ = (int)uStack_cc0 - (int)uStack_cd0;
  local_1c38._12_4_ = uStack_cc0._4_4_ - uStack_cd0._4_4_;
  local_1308 = local_1c38._0_8_;
  uStack_1300 = local_1c38._8_8_;
  local_1318 = local_1bc8;
  iStack_1314 = iStack_1bc4;
  iStack_1310 = iStack_1bc0;
  iStack_130c = iStack_1bbc;
  local_1c38._0_4_ = ((int)local_cc8 - (int)local_cd8) + local_1bc8;
  local_1c38._4_4_ = (local_cc8._4_4_ - local_cd8._4_4_) + iStack_1bc4;
  iVar95 = ((int)uStack_cc0 - (int)uStack_cd0) + iStack_1bc0;
  iVar96 = (uStack_cc0._4_4_ - uStack_cd0._4_4_) + iStack_1bbc;
  local_1c38._8_4_ = iVar95;
  local_1c38._12_4_ = iVar96;
  local_18a8 = local_1c38._0_8_;
  uStack_18a0 = local_1c38._8_8_;
  local_18ac = local_1a04;
  auVar92 = ZEXT416(local_1a04);
  local_1c38._4_4_ = (int)local_1c38._4_4_ >> auVar92;
  local_1c38._0_4_ = (int)local_1c38._0_4_ >> auVar92;
  local_1c38._8_4_ = iVar95 >> auVar92;
  local_1c38._12_4_ = iVar96 >> auVar92;
  local_978 = local_1c18._0_8_;
  uStack_970 = local_1c18._8_8_;
  local_988 = local_1b98;
  uStack_980 = uStack_1b90;
  auVar12._8_8_ = uStack_1b90;
  auVar12._0_8_ = local_1b98;
  auVar92 = pmulld(local_1c18,auVar12);
  local_998 = local_1c28._0_8_;
  uStack_990 = local_1c28._8_8_;
  local_9a8 = local_1b98;
  uStack_9a0 = uStack_1b90;
  auVar11._8_8_ = uStack_1b90;
  auVar11._0_8_ = local_1b98;
  local_1d28 = pmulld(local_1c28,auVar11);
  local_9b8 = local_1c28._0_8_;
  uStack_9b0 = local_1c28._8_8_;
  local_9c8 = local_1ba8;
  uStack_9c0 = uStack_1ba0;
  auVar10._8_8_ = uStack_1ba0;
  auVar10._0_8_ = local_1ba8;
  auVar93 = pmulld(local_1c28,auVar10);
  local_1c28._0_8_ = auVar93._0_8_;
  local_1c28._8_8_ = auVar93._8_8_;
  local_1d18._0_8_ = auVar92._0_8_;
  local_1d18._8_8_ = auVar92._8_8_;
  local_1328 = local_1c28._0_8_;
  uVar63 = local_1328;
  uStack_1320 = local_1c28._8_8_;
  uVar64 = uStack_1320;
  local_1338 = local_1d18._0_8_;
  uVar61 = local_1338;
  uStack_1330 = local_1d18._8_8_;
  uVar62 = uStack_1330;
  local_1328._0_4_ = auVar93._0_4_;
  local_1328._4_4_ = auVar93._4_4_;
  uStack_1320._0_4_ = auVar93._8_4_;
  uStack_1320._4_4_ = auVar93._12_4_;
  local_1338._0_4_ = auVar92._0_4_;
  local_1338._4_4_ = auVar92._4_4_;
  uStack_1330._0_4_ = auVar92._8_4_;
  uStack_1330._4_4_ = auVar92._12_4_;
  local_1c28._4_4_ = local_1328._4_4_ + local_1338._4_4_;
  local_1c28._0_4_ = (int)local_1328 + (int)local_1338;
  local_1c28._8_4_ = (int)uStack_1320 + (int)uStack_1330;
  local_1c28._12_4_ = uStack_1320._4_4_ + uStack_1330._4_4_;
  local_1348 = local_1c28._0_8_;
  uStack_1340 = local_1c28._8_8_;
  local_1358 = local_1bc8;
  iStack_1354 = iStack_1bc4;
  iStack_1350 = iStack_1bc0;
  iStack_134c = iStack_1bbc;
  local_1c28._0_4_ = (int)local_1328 + (int)local_1338 + local_1bc8;
  local_1c28._4_4_ = local_1328._4_4_ + local_1338._4_4_ + iStack_1bc4;
  iVar95 = (int)uStack_1320 + (int)uStack_1330 + iStack_1bc0;
  iVar96 = uStack_1320._4_4_ + uStack_1330._4_4_ + iStack_1bbc;
  local_1c28._8_4_ = iVar95;
  local_1c28._12_4_ = iVar96;
  local_18c8 = local_1c28._0_8_;
  uStack_18c0 = local_1c28._8_8_;
  local_18cc = local_1a04;
  auVar92 = ZEXT416(local_1a04);
  local_1c28._4_4_ = (int)local_1c28._4_4_ >> auVar92;
  local_1c28._0_4_ = (int)local_1c28._0_4_ >> auVar92;
  local_1c28._8_4_ = iVar95 >> auVar92;
  local_1c28._12_4_ = iVar96 >> auVar92;
  local_9d8 = local_1c18._0_8_;
  uStack_9d0 = local_1c18._8_8_;
  local_9e8 = local_1ba8;
  uStack_9e0 = uStack_1ba0;
  auVar9._8_8_ = uStack_1ba0;
  auVar9._0_8_ = local_1ba8;
  local_1d18 = pmulld(local_1c18,auVar9);
  local_ce8 = local_1d28._0_8_;
  uVar78 = local_ce8;
  uStack_ce0 = local_1d28._8_8_;
  uVar79 = uStack_ce0;
  local_cf8 = local_1d18._0_8_;
  uVar98 = local_cf8;
  uStack_cf0 = local_1d18._8_8_;
  uVar77 = uStack_cf0;
  local_ce8._0_4_ = local_1d28._0_4_;
  local_ce8._4_4_ = local_1d28._4_4_;
  uStack_ce0._0_4_ = local_1d28._8_4_;
  uStack_ce0._4_4_ = local_1d28._12_4_;
  local_cf8._0_4_ = local_1d18._0_4_;
  local_cf8._4_4_ = local_1d18._4_4_;
  uStack_cf0._0_4_ = local_1d18._8_4_;
  uStack_cf0._4_4_ = local_1d18._12_4_;
  local_1c18._4_4_ = local_ce8._4_4_ - local_cf8._4_4_;
  local_1c18._0_4_ = (int)local_ce8 - (int)local_cf8;
  local_1c18._8_4_ = (int)uStack_ce0 - (int)uStack_cf0;
  local_1c18._12_4_ = uStack_ce0._4_4_ - uStack_cf0._4_4_;
  local_1368 = local_1c18._0_8_;
  uStack_1360 = local_1c18._8_8_;
  local_1378 = local_1bc8;
  iStack_1374 = iStack_1bc4;
  iStack_1370 = iStack_1bc0;
  iStack_136c = iStack_1bbc;
  local_1c18._0_4_ = ((int)local_ce8 - (int)local_cf8) + local_1bc8;
  local_1c18._4_4_ = (local_ce8._4_4_ - local_cf8._4_4_) + iStack_1bc4;
  iVar95 = ((int)uStack_ce0 - (int)uStack_cf0) + iStack_1bc0;
  iVar96 = (uStack_ce0._4_4_ - uStack_cf0._4_4_) + iStack_1bbc;
  local_1c18._8_4_ = iVar95;
  local_1c18._12_4_ = iVar96;
  local_18e8 = local_1c18._0_8_;
  uStack_18e0 = local_1c18._8_8_;
  local_18ec = local_1a04;
  auVar92 = ZEXT416(local_1a04);
  local_1c18._4_4_ = (int)local_1c18._4_4_ >> auVar92;
  local_1c18._0_4_ = (int)local_1c18._0_4_ >> auVar92;
  local_1c18._8_4_ = iVar95 >> auVar92;
  local_1c18._12_4_ = iVar96 >> auVar92;
  in0_15[1] = &local_1ce8;
  in0_15[0] = (longlong)&local_1d08;
  in1_15[1] = (longlong)&local_1bf8;
  in1_15[0] = (longlong)&local_1be8;
  local_1338 = uVar61;
  uStack_1330 = uVar62;
  local_1328 = uVar63;
  uStack_1320 = uVar64;
  local_12d8 = uVar65;
  uStack_12d0 = uVar66;
  local_12c8 = uVar67;
  uStack_12c0 = uVar68;
  local_1278 = uVar69;
  uStack_1270 = uVar70;
  local_1268 = uVar71;
  uStack_1260 = uVar72;
  local_1218 = uVar73;
  uStack_1210 = uVar74;
  local_1208 = uVar75;
  uStack_1200 = uVar76;
  local_cf8 = uVar98;
  uStack_cf0 = uVar77;
  local_ce8 = uVar78;
  uStack_ce0 = uVar79;
  local_cd8 = uVar80;
  uStack_cd0 = uVar81;
  local_cc8 = uVar82;
  uStack_cc0 = uVar83;
  local_cb8 = uVar84;
  uStack_cb0 = uVar85;
  local_ca8 = uVar86;
  uStack_ca0 = uVar87;
  local_c98 = uVar88;
  uStack_c90 = uVar89;
  local_c88 = uVar90;
  uStack_c80 = uVar91;
  addsub_sse4_1(in0_15,in1_15,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                in_stack_ffffffffffffe298,(__m128i *)CONCAT44(iVar97,in_stack_ffffffffffffe2a0));
  in0_16[0] = &local_1cf8;
  in0_16[1] = &local_1cd8;
  in1_16[1] = (longlong)&local_1bf8;
  in1_16[0] = (longlong)&local_1be8;
  addsub_sse4_1(in0_16,in1_16,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                in_stack_ffffffffffffe298,(__m128i *)CONCAT44(iVar97,in_stack_ffffffffffffe2a0));
  in0_17[0] = local_1cc8;
  in0_17[1] = local_1ca8;
  in1_17[1] = (longlong)&local_1bf8;
  in1_17[0] = (longlong)&local_1be8;
  addsub_sse4_1(in0_17,in1_17,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                in_stack_ffffffffffffe298,(__m128i *)CONCAT44(iVar97,in_stack_ffffffffffffe2a0));
  in0_18[0] = &local_1cb8;
  in0_18[1] = &local_1c98;
  in1_18[1] = (longlong)&local_1bf8;
  in1_18[0] = (longlong)&local_1be8;
  addsub_sse4_1(in0_18,in1_18,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                in_stack_ffffffffffffe298,(__m128i *)CONCAT44(iVar97,in_stack_ffffffffffffe2a0));
  in0_19[0] = local_1c88;
  in0_19[1] = local_1c68;
  in1_19[1] = (longlong)&local_1bf8;
  in1_19[0] = (longlong)&local_1be8;
  addsub_sse4_1(in0_19,in1_19,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                in_stack_ffffffffffffe298,(__m128i *)CONCAT44(iVar97,in_stack_ffffffffffffe2a0));
  in0_20[0] = local_1c78;
  in0_20[1] = local_1c58;
  in1_20[1] = (longlong)&local_1bf8;
  in1_20[0] = (longlong)&local_1be8;
  addsub_sse4_1(in0_20,in1_20,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                in_stack_ffffffffffffe298,(__m128i *)CONCAT44(iVar97,in_stack_ffffffffffffe2a0));
  in0_21[0] = local_1c48;
  in0_21[1] = local_1c28;
  in1_21[1] = (longlong)&local_1bf8;
  in1_21[0] = (longlong)&local_1be8;
  addsub_sse4_1(in0_21,in1_21,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                in_stack_ffffffffffffe298,(__m128i *)CONCAT44(iVar97,in_stack_ffffffffffffe2a0));
  in0_22[0] = local_1c38;
  in0_22[1] = local_1c18;
  in1_22[1] = (longlong)&local_1bf8;
  in1_22[0] = (longlong)&local_1be8;
  addsub_sse4_1(in0_22,in1_22,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                in_stack_ffffffffffffe298,(__m128i *)CONCAT44(iVar97,in_stack_ffffffffffffe2a0));
  local_9f8 = CONCAT44(iStack_1ce4,local_1ce8);
  uStack_9f0 = CONCAT44(iStack_1cdc,iStack_1ce0);
  local_a08 = local_1bb8;
  uStack_a00 = uStack_1bb0;
  auVar8._8_8_ = uStack_9f0;
  auVar8._0_8_ = local_9f8;
  auVar7._8_8_ = uStack_1bb0;
  auVar7._0_8_ = local_1bb8;
  auVar92 = pmulld(auVar8,auVar7);
  local_a18 = CONCAT44(iStack_1cd4,local_1cd8);
  uStack_a10 = CONCAT44(iStack_1ccc,iStack_1cd0);
  local_a28 = local_1bb8;
  uStack_a20 = uStack_1bb0;
  auVar6._8_8_ = uStack_a10;
  auVar6._0_8_ = local_a18;
  auVar5._8_8_ = uStack_1bb0;
  auVar5._0_8_ = local_1bb8;
  auVar93 = pmulld(auVar6,auVar5);
  local_1d28._0_8_ = auVar92._0_8_;
  local_1d28._8_8_ = auVar92._8_8_;
  local_1d18._0_8_ = auVar93._0_8_;
  local_1d18._8_8_ = auVar93._8_8_;
  local_1388 = local_1d28._0_8_;
  uVar75 = local_1388;
  uStack_1380 = local_1d28._8_8_;
  uVar76 = uStack_1380;
  local_1398 = local_1d18._0_8_;
  uVar73 = local_1398;
  uStack_1390 = local_1d18._8_8_;
  uVar74 = uStack_1390;
  local_1388._0_4_ = auVar92._0_4_;
  local_1388._4_4_ = auVar92._4_4_;
  uStack_1380._0_4_ = auVar92._8_4_;
  uStack_1380._4_4_ = auVar92._12_4_;
  local_1398._0_4_ = auVar93._0_4_;
  local_1398._4_4_ = auVar93._4_4_;
  uStack_1390._0_4_ = auVar93._8_4_;
  uStack_1390._4_4_ = auVar93._12_4_;
  local_13a8 = CONCAT44(local_1388._4_4_ + local_1398._4_4_,(int)local_1388 + (int)local_1398);
  uStack_13a0 = CONCAT44(uStack_1380._4_4_ + uStack_1390._4_4_,(int)uStack_1380 + (int)uStack_1390);
  local_13b8 = local_1bc8;
  iStack_13b4 = iStack_1bc4;
  iStack_13b0 = iStack_1bc0;
  iStack_13ac = iStack_1bbc;
  local_1ce8 = (int)local_1388 + (int)local_1398 + local_1bc8;
  iStack_1ce4 = local_1388._4_4_ + local_1398._4_4_ + iStack_1bc4;
  iStack_1ce0 = (int)uStack_1380 + (int)uStack_1390 + iStack_1bc0;
  iStack_1cdc = uStack_1380._4_4_ + uStack_1390._4_4_ + iStack_1bbc;
  local_1908 = CONCAT44(iStack_1ce4,local_1ce8);
  uStack_1900 = CONCAT44(iStack_1cdc,iStack_1ce0);
  local_190c = local_1a04;
  auVar92 = ZEXT416(local_1a04);
  local_1ce8 = local_1ce8 >> auVar92;
  iStack_1ce4 = iStack_1ce4 >> auVar92;
  iStack_1ce0 = iStack_1ce0 >> auVar92;
  iStack_1cdc = iStack_1cdc >> auVar92;
  local_d08 = local_1d28._0_8_;
  uStack_d00 = local_1d28._8_8_;
  local_d18 = local_1d18._0_8_;
  uStack_d10 = local_1d18._8_8_;
  local_13c8 = CONCAT44(local_1388._4_4_ - local_1398._4_4_,(int)local_1388 - (int)local_1398);
  uStack_13c0 = CONCAT44(uStack_1380._4_4_ - uStack_1390._4_4_,(int)uStack_1380 - (int)uStack_1390);
  local_13d8 = local_1bc8;
  iStack_13d4 = iStack_1bc4;
  iStack_13d0 = iStack_1bc0;
  iStack_13cc = iStack_1bbc;
  local_1cd8 = ((int)local_1388 - (int)local_1398) + local_1bc8;
  iStack_1cd4 = (local_1388._4_4_ - local_1398._4_4_) + iStack_1bc4;
  iStack_1cd0 = ((int)uStack_1380 - (int)uStack_1390) + iStack_1bc0;
  iStack_1ccc = (uStack_1380._4_4_ - uStack_1390._4_4_) + iStack_1bbc;
  local_1928 = CONCAT44(iStack_1cd4,local_1cd8);
  uStack_1920 = CONCAT44(iStack_1ccc,iStack_1cd0);
  local_192c = local_1a04;
  auVar92 = ZEXT416(local_1a04);
  local_1cd8 = local_1cd8 >> auVar92;
  iStack_1cd4 = iStack_1cd4 >> auVar92;
  iStack_1cd0 = iStack_1cd0 >> auVar92;
  iStack_1ccc = iStack_1ccc >> auVar92;
  local_a38 = local_1ca8._0_8_;
  uStack_a30 = local_1ca8._8_8_;
  local_a48 = local_1bb8;
  uStack_a40 = uStack_1bb0;
  auVar4._8_8_ = uStack_1bb0;
  auVar4._0_8_ = local_1bb8;
  auVar92 = pmulld(local_1ca8,auVar4);
  local_a58 = CONCAT44(iStack_1c94,local_1c98);
  uStack_a50 = CONCAT44(iStack_1c8c,iStack_1c90);
  local_a68 = local_1bb8;
  uStack_a60 = uStack_1bb0;
  auVar3._8_8_ = uStack_a50;
  auVar3._0_8_ = local_a58;
  auVar2._8_8_ = uStack_1bb0;
  auVar2._0_8_ = local_1bb8;
  auVar93 = pmulld(auVar3,auVar2);
  local_1d28._0_8_ = auVar92._0_8_;
  local_1d28._8_8_ = auVar92._8_8_;
  local_1d18._0_8_ = auVar93._0_8_;
  local_1d18._8_8_ = auVar93._8_8_;
  local_13e8 = local_1d28._0_8_;
  uVar71 = local_13e8;
  uStack_13e0 = local_1d28._8_8_;
  uVar72 = uStack_13e0;
  local_13f8 = local_1d18._0_8_;
  uVar69 = local_13f8;
  uStack_13f0 = local_1d18._8_8_;
  uVar70 = uStack_13f0;
  local_13e8._0_4_ = auVar92._0_4_;
  local_13e8._4_4_ = auVar92._4_4_;
  uStack_13e0._0_4_ = auVar92._8_4_;
  uStack_13e0._4_4_ = auVar92._12_4_;
  local_13f8._0_4_ = auVar93._0_4_;
  local_13f8._4_4_ = auVar93._4_4_;
  uStack_13f0._0_4_ = auVar93._8_4_;
  uStack_13f0._4_4_ = auVar93._12_4_;
  local_1ca8._4_4_ = local_13e8._4_4_ + local_13f8._4_4_;
  local_1ca8._0_4_ = (int)local_13e8 + (int)local_13f8;
  local_1ca8._8_4_ = (int)uStack_13e0 + (int)uStack_13f0;
  local_1ca8._12_4_ = uStack_13e0._4_4_ + uStack_13f0._4_4_;
  local_1408 = local_1ca8._0_8_;
  uStack_1400 = local_1ca8._8_8_;
  local_1418 = local_1bc8;
  iStack_1414 = iStack_1bc4;
  iStack_1410 = iStack_1bc0;
  iStack_140c = iStack_1bbc;
  local_1ca8._0_4_ = (int)local_13e8 + (int)local_13f8 + local_1bc8;
  local_1ca8._4_4_ = local_13e8._4_4_ + local_13f8._4_4_ + iStack_1bc4;
  iVar95 = (int)uStack_13e0 + (int)uStack_13f0 + iStack_1bc0;
  iVar96 = uStack_13e0._4_4_ + uStack_13f0._4_4_ + iStack_1bbc;
  local_1ca8._8_4_ = iVar95;
  local_1ca8._12_4_ = iVar96;
  local_1948 = local_1ca8._0_8_;
  uStack_1940 = local_1ca8._8_8_;
  local_194c = local_1a04;
  auVar92 = ZEXT416(local_1a04);
  local_1ca8._4_4_ = (int)local_1ca8._4_4_ >> auVar92;
  local_1ca8._0_4_ = (int)local_1ca8._0_4_ >> auVar92;
  local_1ca8._8_4_ = iVar95 >> auVar92;
  local_1ca8._12_4_ = iVar96 >> auVar92;
  local_d28 = local_1d28._0_8_;
  uStack_d20 = local_1d28._8_8_;
  local_d38 = local_1d18._0_8_;
  uStack_d30 = local_1d18._8_8_;
  local_1428 = CONCAT44(local_13e8._4_4_ - local_13f8._4_4_,(int)local_13e8 - (int)local_13f8);
  uStack_1420 = CONCAT44(uStack_13e0._4_4_ - uStack_13f0._4_4_,(int)uStack_13e0 - (int)uStack_13f0);
  local_1438 = local_1bc8;
  iStack_1434 = iStack_1bc4;
  iStack_1430 = iStack_1bc0;
  iStack_142c = iStack_1bbc;
  local_1c98 = ((int)local_13e8 - (int)local_13f8) + local_1bc8;
  iStack_1c94 = (local_13e8._4_4_ - local_13f8._4_4_) + iStack_1bc4;
  iStack_1c90 = ((int)uStack_13e0 - (int)uStack_13f0) + iStack_1bc0;
  iStack_1c8c = (uStack_13e0._4_4_ - uStack_13f0._4_4_) + iStack_1bbc;
  local_1968 = CONCAT44(iStack_1c94,local_1c98);
  uStack_1960 = CONCAT44(iStack_1c8c,iStack_1c90);
  local_196c = local_1a04;
  auVar92 = ZEXT416(local_1a04);
  local_1c98 = local_1c98 >> auVar92;
  iStack_1c94 = iStack_1c94 >> auVar92;
  iStack_1c90 = iStack_1c90 >> auVar92;
  iStack_1c8c = iStack_1c8c >> auVar92;
  local_a78 = local_1c68._0_8_;
  uStack_a70 = local_1c68._8_8_;
  local_a88 = local_1bb8;
  uStack_a80 = uStack_1bb0;
  auVar1._8_8_ = uStack_1bb0;
  auVar1._0_8_ = local_1bb8;
  auVar92 = pmulld(local_1c68,auVar1);
  local_a98 = local_1c58._0_8_;
  uStack_a90 = local_1c58._8_8_;
  local_aa8 = local_1bb8;
  uStack_aa0 = uStack_1bb0;
  auVar94._8_8_ = uStack_1bb0;
  auVar94._0_8_ = local_1bb8;
  auVar93 = pmulld(local_1c58,auVar94);
  local_1d28._0_8_ = auVar92._0_8_;
  local_1d28._8_8_ = auVar92._8_8_;
  local_1d18._0_8_ = auVar93._0_8_;
  local_1d18._8_8_ = auVar93._8_8_;
  local_1448 = local_1d28._0_8_;
  uVar67 = local_1448;
  uStack_1440 = local_1d28._8_8_;
  uVar68 = uStack_1440;
  local_1458 = local_1d18._0_8_;
  uVar65 = local_1458;
  uStack_1450 = local_1d18._8_8_;
  uVar66 = uStack_1450;
  local_1448._0_4_ = auVar92._0_4_;
  local_1448._4_4_ = auVar92._4_4_;
  uStack_1440._0_4_ = auVar92._8_4_;
  uStack_1440._4_4_ = auVar92._12_4_;
  local_1458._0_4_ = auVar93._0_4_;
  local_1458._4_4_ = auVar93._4_4_;
  uStack_1450._0_4_ = auVar93._8_4_;
  uStack_1450._4_4_ = auVar93._12_4_;
  local_1c68._4_4_ = local_1448._4_4_ + local_1458._4_4_;
  local_1c68._0_4_ = (int)local_1448 + (int)local_1458;
  local_1c68._8_4_ = (int)uStack_1440 + (int)uStack_1450;
  local_1c68._12_4_ = uStack_1440._4_4_ + uStack_1450._4_4_;
  local_1468 = local_1c68._0_8_;
  uStack_1460 = local_1c68._8_8_;
  local_1478 = local_1bc8;
  iStack_1474 = iStack_1bc4;
  iStack_1470 = iStack_1bc0;
  iStack_146c = iStack_1bbc;
  local_1c68._0_4_ = (int)local_1448 + (int)local_1458 + local_1bc8;
  local_1c68._4_4_ = local_1448._4_4_ + local_1458._4_4_ + iStack_1bc4;
  iVar95 = (int)uStack_1440 + (int)uStack_1450 + iStack_1bc0;
  iVar96 = uStack_1440._4_4_ + uStack_1450._4_4_ + iStack_1bbc;
  local_1c68._8_4_ = iVar95;
  local_1c68._12_4_ = iVar96;
  local_1988 = local_1c68._0_8_;
  uStack_1980 = local_1c68._8_8_;
  local_198c = local_1a04;
  auVar92 = ZEXT416(local_1a04);
  local_1c68._4_4_ = (int)local_1c68._4_4_ >> auVar92;
  local_1c68._0_4_ = (int)local_1c68._0_4_ >> auVar92;
  local_1c68._8_4_ = iVar95 >> auVar92;
  local_1c68._12_4_ = iVar96 >> auVar92;
  local_d48 = local_1d28._0_8_;
  uStack_d40 = local_1d28._8_8_;
  local_d58 = local_1d18._0_8_;
  uStack_d50 = local_1d18._8_8_;
  local_1c58._4_4_ = local_1448._4_4_ - local_1458._4_4_;
  local_1c58._0_4_ = (int)local_1448 - (int)local_1458;
  local_1c58._8_4_ = (int)uStack_1440 - (int)uStack_1450;
  local_1c58._12_4_ = uStack_1440._4_4_ - uStack_1450._4_4_;
  local_1488 = local_1c58._0_8_;
  uStack_1480 = local_1c58._8_8_;
  local_1498 = local_1bc8;
  iStack_1494 = iStack_1bc4;
  iStack_1490 = iStack_1bc0;
  iStack_148c = iStack_1bbc;
  local_1c58._0_4_ = ((int)local_1448 - (int)local_1458) + local_1bc8;
  local_1c58._4_4_ = (local_1448._4_4_ - local_1458._4_4_) + iStack_1bc4;
  iVar95 = ((int)uStack_1440 - (int)uStack_1450) + iStack_1bc0;
  iVar96 = (uStack_1440._4_4_ - uStack_1450._4_4_) + iStack_1bbc;
  local_1c58._8_4_ = iVar95;
  local_1c58._12_4_ = iVar96;
  local_19a8 = local_1c58._0_8_;
  uStack_19a0 = local_1c58._8_8_;
  local_19ac = local_1a04;
  auVar92 = ZEXT416(local_1a04);
  local_1c58._0_4_ = (int)local_1c58._0_4_ >> auVar92;
  local_1c58._4_4_ = (int)local_1c58._4_4_ >> auVar92;
  local_1c58._8_4_ = iVar95 >> auVar92;
  local_1c58._12_4_ = iVar96 >> auVar92;
  local_ab8 = local_1c28._0_8_;
  uStack_ab0 = local_1c28._8_8_;
  local_ac8 = local_1bb8;
  uStack_ac0 = uStack_1bb0;
  auVar93._8_8_ = uStack_1bb0;
  auVar93._0_8_ = local_1bb8;
  local_1d28 = pmulld(local_1c28,auVar93);
  local_ad8 = local_1c18._0_8_;
  uStack_ad0 = local_1c18._8_8_;
  local_ae8 = local_1bb8;
  uStack_ae0 = uStack_1bb0;
  auVar92._8_8_ = uStack_1bb0;
  auVar92._0_8_ = local_1bb8;
  local_1d18 = pmulld(local_1c18,auVar92);
  local_14a8 = local_1d28._0_8_;
  uVar63 = local_14a8;
  uStack_14a0 = local_1d28._8_8_;
  uVar64 = uStack_14a0;
  local_14b8 = local_1d18._0_8_;
  uVar61 = local_14b8;
  uStack_14b0 = local_1d18._8_8_;
  uVar62 = uStack_14b0;
  local_14a8._0_4_ = local_1d28._0_4_;
  local_14a8._4_4_ = local_1d28._4_4_;
  uStack_14a0._0_4_ = local_1d28._8_4_;
  uStack_14a0._4_4_ = local_1d28._12_4_;
  local_14b8._0_4_ = local_1d18._0_4_;
  local_14b8._4_4_ = local_1d18._4_4_;
  uStack_14b0._0_4_ = local_1d18._8_4_;
  uStack_14b0._4_4_ = local_1d18._12_4_;
  local_1c28._4_4_ = local_14a8._4_4_ + local_14b8._4_4_;
  local_1c28._0_4_ = (int)local_14a8 + (int)local_14b8;
  local_1c28._8_4_ = (int)uStack_14a0 + (int)uStack_14b0;
  local_1c28._12_4_ = uStack_14a0._4_4_ + uStack_14b0._4_4_;
  local_14c8 = local_1c28._0_8_;
  uStack_14c0 = local_1c28._8_8_;
  local_14d8 = local_1bc8;
  iStack_14d4 = iStack_1bc4;
  iStack_14d0 = iStack_1bc0;
  iStack_14cc = iStack_1bbc;
  local_1c28._0_4_ = (int)local_14a8 + (int)local_14b8 + local_1bc8;
  local_1c28._4_4_ = local_14a8._4_4_ + local_14b8._4_4_ + iStack_1bc4;
  iVar95 = (int)uStack_14a0 + (int)uStack_14b0 + iStack_1bc0;
  iVar96 = uStack_14a0._4_4_ + uStack_14b0._4_4_ + iStack_1bbc;
  local_1c28._8_4_ = iVar95;
  local_1c28._12_4_ = iVar96;
  local_19c8 = local_1c28._0_8_;
  uStack_19c0 = local_1c28._8_8_;
  local_19cc = local_1a04;
  auVar92 = ZEXT416(local_1a04);
  local_1c28._0_4_ = (int)local_1c28._0_4_ >> auVar92;
  local_1c28._4_4_ = (int)local_1c28._4_4_ >> auVar92;
  local_1c28._8_4_ = iVar95 >> auVar92;
  local_1c28._12_4_ = iVar96 >> auVar92;
  local_d68 = local_1d28._0_8_;
  uStack_d60 = local_1d28._8_8_;
  local_d78 = local_1d18._0_8_;
  uStack_d70 = local_1d18._8_8_;
  local_1c18._4_4_ = local_14a8._4_4_ - local_14b8._4_4_;
  local_1c18._0_4_ = (int)local_14a8 - (int)local_14b8;
  local_1c18._8_4_ = (int)uStack_14a0 - (int)uStack_14b0;
  local_1c18._12_4_ = uStack_14a0._4_4_ - uStack_14b0._4_4_;
  local_14e8 = local_1c18._0_8_;
  uStack_14e0 = local_1c18._8_8_;
  local_14f8 = local_1bc8;
  iStack_14f4 = iStack_1bc4;
  iStack_14f0 = iStack_1bc0;
  iStack_14ec = iStack_1bbc;
  local_1c18._0_4_ = ((int)local_14a8 - (int)local_14b8) + local_1bc8;
  local_1c18._4_4_ = (local_14a8._4_4_ - local_14b8._4_4_) + iStack_1bc4;
  iVar95 = ((int)uStack_14a0 - (int)uStack_14b0) + iStack_1bc0;
  iVar96 = (uStack_14a0._4_4_ - uStack_14b0._4_4_) + iStack_1bbc;
  local_1c18._8_4_ = iVar95;
  local_1c18._12_4_ = iVar96;
  local_19e8 = local_1c18._0_8_;
  uStack_19e0 = local_1c18._8_8_;
  local_19ec = local_1a04;
  auVar92 = ZEXT416(local_1a04);
  local_1c18._4_4_ = (int)local_1c18._4_4_ >> auVar92;
  local_1c18._0_4_ = (int)local_1c18._0_4_ >> auVar92;
  local_1c18._8_4_ = iVar95 >> auVar92;
  local_1c18._12_4_ = iVar96 >> auVar92;
  if (local_1a08 == 0) {
    if (local_1a0c + 6 < 0x10) {
      iVar95 = 0x10;
    }
    else {
      iVar95 = local_1a0c + 6;
    }
    local_1d2c._0_1_ = (char)iVar95;
    local_b60 = -(1 << ((char)local_1d2c - 1U & 0x1f));
    local_1d48 = CONCAT44(local_b60,local_b60);
    uStack_1d40 = CONCAT44(local_b60,local_b60);
    local_b64 = (1 << ((char)local_1d2c - 1U & 0x1f)) + -1;
    uVar98 = CONCAT44(local_b64,local_b64);
    uStack_20 = CONCAT44(local_b64,local_b64);
    in0_23[1] = local_1a00 + 2;
    in0_23[0] = (longlong)local_1a00;
    in1_23[1] = (longlong)&stack0xffffffffffffe2a8;
    in1_23[0] = (longlong)&local_1d48;
    local_1d2c = iVar95;
    local_14b8 = uVar61;
    uStack_14b0 = uVar62;
    local_14a8 = uVar63;
    uStack_14a0 = uVar64;
    local_1458 = uVar65;
    uStack_1450 = uVar66;
    local_1448 = uVar67;
    uStack_1440 = uVar68;
    local_13f8 = uVar69;
    uStack_13f0 = uVar70;
    local_13e8 = uVar71;
    uStack_13e0 = uVar72;
    local_1398 = uVar73;
    uStack_1390 = uVar74;
    local_1388 = uVar75;
    uStack_1380 = uVar76;
    local_48 = local_1d48;
    uStack_40 = uStack_1d40;
    local_38 = local_b60;
    local_34 = local_b60;
    local_30 = local_b60;
    local_2c = local_b60;
    local_28 = uVar98;
    local_10 = local_b64;
    local_c = local_b64;
    local_8 = local_b64;
    local_4 = local_b64;
    neg_shift_sse4_1(in0_23,in1_23,(__m128i *)(ulong)local_1a10,
                     (__m128i *)CONCAT44(in_register_0000008c,in_R9D),in_stack_ffffffffffffe298,
                     (__m128i *)CONCAT44(iVar97,iVar95),local_b64);
    in0_24[0] = local_1a00 + 4;
    in0_24[1] = local_1a00 + 6;
    iVar96 = (int)uVar98;
    in1_24[1] = (longlong)&stack0xffffffffffffe2a8;
    in1_24[0] = (longlong)&local_1d48;
    neg_shift_sse4_1(in0_24,in1_24,(__m128i *)(ulong)local_1a10,
                     (__m128i *)CONCAT44(in_register_0000008c,in_R9D),in_stack_ffffffffffffe298,
                     (__m128i *)CONCAT44(iVar97,iVar95),iVar96);
    in0_25[0] = local_1a00 + 8;
    in0_25[1] = local_1a00 + 10;
    in1_25[1] = (longlong)&stack0xffffffffffffe2a8;
    in1_25[0] = (longlong)&local_1d48;
    neg_shift_sse4_1(in0_25,in1_25,(__m128i *)(ulong)local_1a10,
                     (__m128i *)CONCAT44(in_register_0000008c,in_R9D),in_stack_ffffffffffffe298,
                     (__m128i *)CONCAT44(iVar97,iVar95),iVar96);
    in0_26[0] = local_1a00 + 0xc;
    in0_26[1] = local_1a00 + 0xe;
    in1_26[1] = (longlong)&stack0xffffffffffffe2a8;
    in1_26[0] = (longlong)&local_1d48;
    neg_shift_sse4_1(in0_26,in1_26,(__m128i *)(ulong)local_1a10,
                     (__m128i *)CONCAT44(in_register_0000008c,in_R9D),in_stack_ffffffffffffe298,
                     (__m128i *)CONCAT44(iVar97,iVar95),iVar96);
    in0_27[0] = local_1a00 + 0x10;
    in0_27[1] = local_1a00 + 0x12;
    in1_27[1] = (longlong)&stack0xffffffffffffe2a8;
    in1_27[0] = (longlong)&local_1d48;
    neg_shift_sse4_1(in0_27,in1_27,(__m128i *)(ulong)local_1a10,
                     (__m128i *)CONCAT44(in_register_0000008c,in_R9D),in_stack_ffffffffffffe298,
                     (__m128i *)CONCAT44(iVar97,iVar95),iVar96);
    in0_28[0] = local_1a00 + 0x14;
    in0_28[1] = local_1a00 + 0x16;
    in1_28[1] = (longlong)&stack0xffffffffffffe2a8;
    in1_28[0] = (longlong)&local_1d48;
    neg_shift_sse4_1(in0_28,in1_28,(__m128i *)(ulong)local_1a10,
                     (__m128i *)CONCAT44(in_register_0000008c,in_R9D),in_stack_ffffffffffffe298,
                     (__m128i *)CONCAT44(iVar97,iVar95),iVar96);
    in0_29[0] = local_1a00 + 0x18;
    in0_29[1] = local_1a00 + 0x1a;
    in1_29[1] = (longlong)&stack0xffffffffffffe2a8;
    in1_29[0] = (longlong)&local_1d48;
    neg_shift_sse4_1(in0_29,in1_29,(__m128i *)(ulong)local_1a10,
                     (__m128i *)CONCAT44(in_register_0000008c,in_R9D),in_stack_ffffffffffffe298,
                     (__m128i *)CONCAT44(iVar97,iVar95),iVar96);
    in0_30[0] = local_1a00 + 0x1c;
    in0_30[1] = local_1a00 + 0x1e;
    in1_30[1] = (longlong)&stack0xffffffffffffe2a8;
    in1_30[0] = (longlong)&local_1d48;
    neg_shift_sse4_1(in0_30,in1_30,(__m128i *)(ulong)local_1a10,
                     (__m128i *)CONCAT44(in_register_0000008c,in_R9D),in_stack_ffffffffffffe298,
                     (__m128i *)CONCAT44(iVar97,iVar95),iVar96);
  }
  else {
    *local_1a00 = CONCAT44(iStack_1d04,local_1d08);
    local_1a00[1] = CONCAT44(iStack_1cfc,iStack_1d00);
    local_d88 = (int)local_1c08;
    iStack_d84 = (int)((ulong)local_1c08 >> 0x20);
    iStack_d80 = (int)uStack_1c00;
    iStack_d7c = (int)((ulong)uStack_1c00 >> 0x20);
    local_d98 = local_1c88._0_4_;
    iStack_d94 = local_1c88._4_4_;
    iStack_d90 = local_1c88._8_4_;
    iStack_d8c = local_1c88._12_4_;
    *(int *)(local_1a00 + 2) = local_d88 - local_d98;
    *(int *)((long)local_1a00 + 0x14) = iStack_d84 - iStack_d94;
    *(int *)(local_1a00 + 3) = iStack_d80 - iStack_d90;
    *(int *)((long)local_1a00 + 0x1c) = iStack_d7c - iStack_d8c;
    local_1a00[4] = local_1c48._0_8_;
    local_1a00[5] = local_1c48._8_8_;
    local_db8 = local_1cc8._0_4_;
    iStack_db4 = local_1cc8._4_4_;
    iStack_db0 = local_1cc8._8_4_;
    iStack_dac = local_1cc8._12_4_;
    *(int *)(local_1a00 + 6) = local_d88 - local_db8;
    *(int *)((long)local_1a00 + 0x34) = iStack_d84 - iStack_db4;
    *(int *)(local_1a00 + 7) = iStack_d80 - iStack_db0;
    *(int *)((long)local_1a00 + 0x3c) = iStack_d7c - iStack_dac;
    local_1a00[8] = local_1ca8._0_8_;
    local_1a00[9] = local_1ca8._8_8_;
    *(int *)(local_1a00 + 10) = local_d88 - local_1c28._0_4_;
    *(int *)((long)local_1a00 + 0x54) = iStack_d84 - local_1c28._4_4_;
    *(int *)(local_1a00 + 0xb) = iStack_d80 - local_1c28._8_4_;
    *(int *)((long)local_1a00 + 0x5c) = iStack_d7c - local_1c28._12_4_;
    local_1a00[0xc] = local_1c68._0_8_;
    local_1a00[0xd] = local_1c68._8_8_;
    *(int *)(local_1a00 + 0xe) = local_d88 - local_1ce8;
    *(int *)((long)local_1a00 + 0x74) = iStack_d84 - iStack_1ce4;
    *(int *)(local_1a00 + 0xf) = iStack_d80 - iStack_1ce0;
    *(int *)((long)local_1a00 + 0x7c) = iStack_d7c - iStack_1cdc;
    local_1a00[0x10] = CONCAT44(iStack_1cd4,local_1cd8);
    local_1a00[0x11] = CONCAT44(iStack_1ccc,iStack_1cd0);
    *(int *)(local_1a00 + 0x12) = local_d88 - local_1c58._0_4_;
    *(int *)((long)local_1a00 + 0x94) = iStack_d84 - local_1c58._4_4_;
    *(int *)(local_1a00 + 0x13) = iStack_d80 - local_1c58._8_4_;
    *(int *)((long)local_1a00 + 0x9c) = iStack_d7c - local_1c58._12_4_;
    local_1a00[0x14] = local_1c18._0_8_;
    local_1a00[0x15] = local_1c18._8_8_;
    *(int *)(local_1a00 + 0x16) = local_d88 - local_1c98;
    *(int *)((long)local_1a00 + 0xb4) = iStack_d84 - iStack_1c94;
    *(int *)(local_1a00 + 0x17) = iStack_d80 - iStack_1c90;
    *(int *)((long)local_1a00 + 0xbc) = iStack_d7c - iStack_1c8c;
    local_1a00[0x18] = CONCAT44(iStack_1cb4,local_1cb8);
    local_1a00[0x19] = CONCAT44(iStack_1cac,iStack_1cb0);
    local_e58 = local_1c38._0_4_;
    iStack_e54 = local_1c38._4_4_;
    iStack_e50 = local_1c38._8_4_;
    iStack_e4c = local_1c38._12_4_;
    *(int *)(local_1a00 + 0x1a) = local_d88 - local_e58;
    *(int *)((long)local_1a00 + 0xd4) = iStack_d84 - iStack_e54;
    *(int *)(local_1a00 + 0x1b) = iStack_d80 - iStack_e50;
    *(int *)((long)local_1a00 + 0xdc) = iStack_d7c - iStack_e4c;
    local_1a00[0x1c] = local_1c78._0_8_;
    local_1a00[0x1d] = local_1c78._8_8_;
    *(int *)(local_1a00 + 0x1e) = local_d88 - local_1cf8;
    *(int *)((long)local_1a00 + 0xf4) = iStack_d84 - iStack_1cf4;
    *(int *)(local_1a00 + 0x1f) = iStack_d80 - iStack_1cf0;
    *(int *)((long)local_1a00 + 0xfc) = iStack_d7c - iStack_1cec;
  }
  return;
}

Assistant:

static void iadst16x16_low8_sse4_1(__m128i *in, __m128i *out, int bit,
                                   int do_cols, int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi2 = _mm_set1_epi32(cospi[2]);
  const __m128i cospi62 = _mm_set1_epi32(cospi[62]);
  const __m128i cospi10 = _mm_set1_epi32(cospi[10]);
  const __m128i cospi54 = _mm_set1_epi32(cospi[54]);
  const __m128i cospi18 = _mm_set1_epi32(cospi[18]);
  const __m128i cospi46 = _mm_set1_epi32(cospi[46]);
  const __m128i cospi26 = _mm_set1_epi32(cospi[26]);
  const __m128i cospi38 = _mm_set1_epi32(cospi[38]);
  const __m128i cospi34 = _mm_set1_epi32(cospi[34]);
  const __m128i cospi30 = _mm_set1_epi32(cospi[30]);
  const __m128i cospi42 = _mm_set1_epi32(cospi[42]);
  const __m128i cospi22 = _mm_set1_epi32(cospi[22]);
  const __m128i cospi50 = _mm_set1_epi32(cospi[50]);
  const __m128i cospi14 = _mm_set1_epi32(cospi[14]);
  const __m128i cospi58 = _mm_set1_epi32(cospi[58]);
  const __m128i cospi6 = _mm_set1_epi32(cospi[6]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospi40 = _mm_set1_epi32(cospi[40]);
  const __m128i cospi24 = _mm_set1_epi32(cospi[24]);
  const __m128i cospim56 = _mm_set1_epi32(-cospi[56]);
  const __m128i cospim24 = _mm_set1_epi32(-cospi[24]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospim48 = _mm_set1_epi32(-cospi[48]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
  __m128i zero = _mm_setzero_si128();
  __m128i u[16], x, y;

  // stage 0
  // stage 1
  // stage 2
  x = _mm_mullo_epi32(in[0], cospi62);
  u[0] = _mm_add_epi32(x, rnding);
  u[0] = _mm_srai_epi32(u[0], bit);

  x = _mm_mullo_epi32(in[0], cospi2);
  u[1] = _mm_sub_epi32(zero, x);
  u[1] = _mm_add_epi32(u[1], rnding);
  u[1] = _mm_srai_epi32(u[1], bit);

  x = _mm_mullo_epi32(in[2], cospi54);
  u[2] = _mm_add_epi32(x, rnding);
  u[2] = _mm_srai_epi32(u[2], bit);

  x = _mm_mullo_epi32(in[2], cospi10);
  u[3] = _mm_sub_epi32(zero, x);
  u[3] = _mm_add_epi32(u[3], rnding);
  u[3] = _mm_srai_epi32(u[3], bit);

  x = _mm_mullo_epi32(in[4], cospi46);
  u[4] = _mm_add_epi32(x, rnding);
  u[4] = _mm_srai_epi32(u[4], bit);

  x = _mm_mullo_epi32(in[4], cospi18);
  u[5] = _mm_sub_epi32(zero, x);
  u[5] = _mm_add_epi32(u[5], rnding);
  u[5] = _mm_srai_epi32(u[5], bit);

  x = _mm_mullo_epi32(in[6], cospi38);
  u[6] = _mm_add_epi32(x, rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  x = _mm_mullo_epi32(in[6], cospi26);
  u[7] = _mm_sub_epi32(zero, x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  u[8] = _mm_mullo_epi32(in[7], cospi34);
  u[8] = _mm_add_epi32(u[8], rnding);
  u[8] = _mm_srai_epi32(u[8], bit);

  u[9] = _mm_mullo_epi32(in[7], cospi30);
  u[9] = _mm_add_epi32(u[9], rnding);
  u[9] = _mm_srai_epi32(u[9], bit);

  u[10] = _mm_mullo_epi32(in[5], cospi42);
  u[10] = _mm_add_epi32(u[10], rnding);
  u[10] = _mm_srai_epi32(u[10], bit);

  u[11] = _mm_mullo_epi32(in[5], cospi22);
  u[11] = _mm_add_epi32(u[11], rnding);
  u[11] = _mm_srai_epi32(u[11], bit);

  u[12] = _mm_mullo_epi32(in[3], cospi50);
  u[12] = _mm_add_epi32(u[12], rnding);
  u[12] = _mm_srai_epi32(u[12], bit);

  u[13] = _mm_mullo_epi32(in[3], cospi14);
  u[13] = _mm_add_epi32(u[13], rnding);
  u[13] = _mm_srai_epi32(u[13], bit);

  u[14] = _mm_mullo_epi32(in[1], cospi58);
  u[14] = _mm_add_epi32(u[14], rnding);
  u[14] = _mm_srai_epi32(u[14], bit);

  u[15] = _mm_mullo_epi32(in[1], cospi6);
  u[15] = _mm_add_epi32(u[15], rnding);
  u[15] = _mm_srai_epi32(u[15], bit);

  // stage 3
  addsub_sse4_1(u[0], u[8], &u[0], &u[8], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[9], &u[1], &u[9], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[2], u[10], &u[2], &u[10], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[3], u[11], &u[3], &u[11], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[4], u[12], &u[4], &u[12], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[5], u[13], &u[5], &u[13], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[6], u[14], &u[6], &u[14], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[7], u[15], &u[7], &u[15], &clamp_lo, &clamp_hi);

  // stage 4
  y = _mm_mullo_epi32(u[8], cospi56);
  x = _mm_mullo_epi32(u[9], cospi56);
  u[8] = _mm_mullo_epi32(u[8], cospi8);
  u[8] = _mm_add_epi32(u[8], x);
  u[8] = _mm_add_epi32(u[8], rnding);
  u[8] = _mm_srai_epi32(u[8], bit);

  x = _mm_mullo_epi32(u[9], cospi8);
  u[9] = _mm_sub_epi32(y, x);
  u[9] = _mm_add_epi32(u[9], rnding);
  u[9] = _mm_srai_epi32(u[9], bit);

  x = _mm_mullo_epi32(u[11], cospi24);
  y = _mm_mullo_epi32(u[10], cospi24);
  u[10] = _mm_mullo_epi32(u[10], cospi40);
  u[10] = _mm_add_epi32(u[10], x);
  u[10] = _mm_add_epi32(u[10], rnding);
  u[10] = _mm_srai_epi32(u[10], bit);

  x = _mm_mullo_epi32(u[11], cospi40);
  u[11] = _mm_sub_epi32(y, x);
  u[11] = _mm_add_epi32(u[11], rnding);
  u[11] = _mm_srai_epi32(u[11], bit);

  x = _mm_mullo_epi32(u[13], cospi8);
  y = _mm_mullo_epi32(u[12], cospi8);
  u[12] = _mm_mullo_epi32(u[12], cospim56);
  u[12] = _mm_add_epi32(u[12], x);
  u[12] = _mm_add_epi32(u[12], rnding);
  u[12] = _mm_srai_epi32(u[12], bit);

  x = _mm_mullo_epi32(u[13], cospim56);
  u[13] = _mm_sub_epi32(y, x);
  u[13] = _mm_add_epi32(u[13], rnding);
  u[13] = _mm_srai_epi32(u[13], bit);

  x = _mm_mullo_epi32(u[15], cospi40);
  y = _mm_mullo_epi32(u[14], cospi40);
  u[14] = _mm_mullo_epi32(u[14], cospim24);
  u[14] = _mm_add_epi32(u[14], x);
  u[14] = _mm_add_epi32(u[14], rnding);
  u[14] = _mm_srai_epi32(u[14], bit);

  x = _mm_mullo_epi32(u[15], cospim24);
  u[15] = _mm_sub_epi32(y, x);
  u[15] = _mm_add_epi32(u[15], rnding);
  u[15] = _mm_srai_epi32(u[15], bit);

  // stage 5
  addsub_sse4_1(u[0], u[4], &u[0], &u[4], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[5], &u[1], &u[5], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[2], u[6], &u[2], &u[6], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[3], u[7], &u[3], &u[7], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[8], u[12], &u[8], &u[12], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[9], u[13], &u[9], &u[13], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[10], u[14], &u[10], &u[14], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[11], u[15], &u[11], &u[15], &clamp_lo, &clamp_hi);

  // stage 6
  x = _mm_mullo_epi32(u[5], cospi48);
  y = _mm_mullo_epi32(u[4], cospi48);
  u[4] = _mm_mullo_epi32(u[4], cospi16);
  u[4] = _mm_add_epi32(u[4], x);
  u[4] = _mm_add_epi32(u[4], rnding);
  u[4] = _mm_srai_epi32(u[4], bit);

  x = _mm_mullo_epi32(u[5], cospi16);
  u[5] = _mm_sub_epi32(y, x);
  u[5] = _mm_add_epi32(u[5], rnding);
  u[5] = _mm_srai_epi32(u[5], bit);

  x = _mm_mullo_epi32(u[7], cospi16);
  y = _mm_mullo_epi32(u[6], cospi16);
  u[6] = _mm_mullo_epi32(u[6], cospim48);
  u[6] = _mm_add_epi32(u[6], x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  x = _mm_mullo_epi32(u[7], cospim48);
  u[7] = _mm_sub_epi32(y, x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  x = _mm_mullo_epi32(u[13], cospi48);
  y = _mm_mullo_epi32(u[12], cospi48);
  u[12] = _mm_mullo_epi32(u[12], cospi16);
  u[12] = _mm_add_epi32(u[12], x);
  u[12] = _mm_add_epi32(u[12], rnding);
  u[12] = _mm_srai_epi32(u[12], bit);

  x = _mm_mullo_epi32(u[13], cospi16);
  u[13] = _mm_sub_epi32(y, x);
  u[13] = _mm_add_epi32(u[13], rnding);
  u[13] = _mm_srai_epi32(u[13], bit);

  x = _mm_mullo_epi32(u[15], cospi16);
  y = _mm_mullo_epi32(u[14], cospi16);
  u[14] = _mm_mullo_epi32(u[14], cospim48);
  u[14] = _mm_add_epi32(u[14], x);
  u[14] = _mm_add_epi32(u[14], rnding);
  u[14] = _mm_srai_epi32(u[14], bit);

  x = _mm_mullo_epi32(u[15], cospim48);
  u[15] = _mm_sub_epi32(y, x);
  u[15] = _mm_add_epi32(u[15], rnding);
  u[15] = _mm_srai_epi32(u[15], bit);

  // stage 7
  addsub_sse4_1(u[0], u[2], &u[0], &u[2], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[3], &u[1], &u[3], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[4], u[6], &u[4], &u[6], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[5], u[7], &u[5], &u[7], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[8], u[10], &u[8], &u[10], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[9], u[11], &u[9], &u[11], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[12], u[14], &u[12], &u[14], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[13], u[15], &u[13], &u[15], &clamp_lo, &clamp_hi);

  // stage 8
  y = _mm_mullo_epi32(u[2], cospi32);
  x = _mm_mullo_epi32(u[3], cospi32);
  u[2] = _mm_add_epi32(y, x);
  u[2] = _mm_add_epi32(u[2], rnding);
  u[2] = _mm_srai_epi32(u[2], bit);

  u[3] = _mm_sub_epi32(y, x);
  u[3] = _mm_add_epi32(u[3], rnding);
  u[3] = _mm_srai_epi32(u[3], bit);
  y = _mm_mullo_epi32(u[6], cospi32);
  x = _mm_mullo_epi32(u[7], cospi32);
  u[6] = _mm_add_epi32(y, x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  u[7] = _mm_sub_epi32(y, x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  y = _mm_mullo_epi32(u[10], cospi32);
  x = _mm_mullo_epi32(u[11], cospi32);
  u[10] = _mm_add_epi32(y, x);
  u[10] = _mm_add_epi32(u[10], rnding);
  u[10] = _mm_srai_epi32(u[10], bit);

  u[11] = _mm_sub_epi32(y, x);
  u[11] = _mm_add_epi32(u[11], rnding);
  u[11] = _mm_srai_epi32(u[11], bit);

  y = _mm_mullo_epi32(u[14], cospi32);
  x = _mm_mullo_epi32(u[15], cospi32);
  u[14] = _mm_add_epi32(y, x);
  u[14] = _mm_add_epi32(u[14], rnding);
  u[14] = _mm_srai_epi32(u[14], bit);

  u[15] = _mm_sub_epi32(y, x);
  u[15] = _mm_add_epi32(u[15], rnding);
  u[15] = _mm_srai_epi32(u[15], bit);

  // stage 9
  if (do_cols) {
    out[0] = u[0];
    out[1] = _mm_sub_epi32(zero, u[8]);
    out[2] = u[12];
    out[3] = _mm_sub_epi32(zero, u[4]);
    out[4] = u[6];
    out[5] = _mm_sub_epi32(zero, u[14]);
    out[6] = u[10];
    out[7] = _mm_sub_epi32(zero, u[2]);
    out[8] = u[3];
    out[9] = _mm_sub_epi32(zero, u[11]);
    out[10] = u[15];
    out[11] = _mm_sub_epi32(zero, u[7]);
    out[12] = u[5];
    out[13] = _mm_sub_epi32(zero, u[13]);
    out[14] = u[9];
    out[15] = _mm_sub_epi32(zero, u[1]);
  } else {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    const __m128i clamp_hi_out = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);

    neg_shift_sse4_1(u[0], u[8], out + 0, out + 1, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(u[12], u[4], out + 2, out + 3, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(u[6], u[14], out + 4, out + 5, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(u[10], u[2], out + 6, out + 7, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(u[3], u[11], out + 8, out + 9, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(u[15], u[7], out + 10, out + 11, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(u[5], u[13], out + 12, out + 13, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(u[9], u[1], out + 14, out + 15, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
  }
}